

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O1

void embree::avx512::CurveNiIntersector1<8>::
     intersect_hn<embree::avx512::OrientedCurve1Intersector1<embree::HermiteCurveT,7,8>,embree::avx512::Intersect1Epilog1<true>>
               (Precalculations *pre,RayHit *ray,RayQueryContext *context,Primitive *prim)

{
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar1;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar2;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar3;
  Primitive PVar4;
  uint uVar5;
  Geometry *pGVar6;
  long lVar7;
  __int_type_conflict _Var8;
  RTCFilterFunctionN p_Var9;
  bool bVar10;
  bool bVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  byte bVar23;
  uint uVar24;
  ulong uVar25;
  uint uVar27;
  uint uVar28;
  ulong uVar29;
  long lVar30;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  uint uVar31;
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar58 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar77 [32];
  undefined1 auVar79 [32];
  undefined1 auVar81 [32];
  undefined1 auVar83 [32];
  undefined1 auVar85 [32];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar87 [32];
  int iVar88;
  float t1;
  float fVar89;
  undefined4 uVar90;
  float fVar92;
  float fVar93;
  float fVar94;
  undefined1 auVar91 [16];
  float fVar95;
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  float fVar112;
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  vfloat4 a0_2;
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  vfloat4 b0;
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  vfloat4 a0_3;
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [32];
  __m128 a_1;
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [32];
  __m128 a;
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [32];
  undefined1 auVar178 [32];
  undefined1 auVar179 [32];
  float fVar190;
  float fVar191;
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  float fVar192;
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  float fVar193;
  float fVar194;
  float fVar195;
  float fVar196;
  float fVar205;
  float fVar206;
  vfloat4 a0_1;
  float fVar207;
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  float fVar208;
  float fVar215;
  float fVar216;
  vfloat4 a0;
  undefined1 auVar209 [16];
  float fVar217;
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [32];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [64];
  undefined1 auVar230 [32];
  undefined1 auVar231 [64];
  undefined1 auVar232 [64];
  undefined1 auVar233 [64];
  undefined1 in_ZMM19 [64];
  undefined1 auVar234 [64];
  undefined1 auVar235 [64];
  undefined1 auVar236 [64];
  undefined1 auVar237 [64];
  undefined1 auVar238 [64];
  undefined1 auVar239 [64];
  undefined1 auVar240 [64];
  undefined1 auVar241 [64];
  RTCFilterFunctionNArguments args;
  uint mask_stack [4];
  BBox1f cu_stack [4];
  BBox1f cv_stack [4];
  int local_368;
  float local_364;
  ulong local_360;
  undefined1 local_358 [16];
  undefined1 local_348 [16];
  long local_330;
  Primitive *local_328;
  ulong local_320;
  undefined1 local_318 [16];
  undefined1 local_308 [16];
  undefined1 local_2f8 [16];
  undefined1 local_2e8 [16];
  RayQueryContext *local_2d0;
  RTCFilterFunctionNArguments local_2c8;
  undefined1 local_298 [16];
  undefined1 local_288 [8];
  float fStack_280;
  float fStack_27c;
  undefined1 local_278 [8];
  float fStack_270;
  float fStack_26c;
  undefined1 local_268 [16];
  undefined1 local_258 [16];
  undefined1 local_248 [8];
  float fStack_240;
  float fStack_23c;
  undefined1 local_238 [16];
  undefined1 local_228 [8];
  float fStack_220;
  float fStack_21c;
  undefined1 local_218 [16];
  undefined1 local_208 [16];
  undefined1 local_1f8 [8];
  float fStack_1f0;
  float fStack_1ec;
  undefined1 local_1e8 [8];
  float fStack_1e0;
  float fStack_1dc;
  undefined1 local_1d8 [8];
  float fStack_1d0;
  float fStack_1cc;
  undefined1 local_1c8 [8];
  float fStack_1c0;
  float fStack_1bc;
  undefined1 local_1b8 [8];
  float fStack_1b0;
  float fStack_1ac;
  undefined1 local_1a8 [16];
  undefined1 local_198 [16];
  undefined1 local_188 [16];
  undefined1 local_178 [16];
  uint auStack_168 [4];
  undefined8 local_158;
  float local_150;
  undefined8 local_14c;
  uint local_144;
  uint local_140;
  uint local_13c;
  uint local_138;
  undefined1 local_128 [8];
  float fStack_120;
  float fStack_11c;
  undefined1 local_118 [16];
  undefined1 local_108 [16];
  undefined1 local_f8 [16];
  undefined1 local_e8 [16];
  uint uStack_d8;
  float afStack_d4 [7];
  undefined1 local_b8 [32];
  undefined1 local_98 [32];
  undefined1 local_78 [32];
  ulong auStack_58 [5];
  ulong uVar26;
  undefined1 auVar57 [32];
  undefined1 auVar59 [32];
  undefined1 auVar76 [32];
  undefined1 auVar78 [32];
  undefined1 auVar80 [32];
  undefined1 auVar82 [32];
  undefined1 auVar84 [32];
  undefined1 auVar86 [32];
  undefined1 auVar222 [32];
  
  PVar4 = prim[1];
  uVar26 = (ulong)(byte)PVar4;
  fVar195 = *(float *)(prim + uVar26 * 0x19 + 0x12);
  auVar37 = vsubps_avx((undefined1  [16])(ray->super_RayK<1>).org.field_0,
                       *(undefined1 (*) [16])(prim + uVar26 * 0x19 + 6));
  fVar112 = fVar195 * auVar37._0_4_;
  fVar89 = fVar195 * (ray->super_RayK<1>).dir.field_0.m128[0];
  auVar32._8_8_ = 0;
  auVar32._0_8_ = *(ulong *)(prim + uVar26 * 4 + 6);
  auVar55 = vpmovsxbd_avx2(auVar32);
  auVar42._8_8_ = 0;
  auVar42._0_8_ = *(ulong *)(prim + uVar26 * 5 + 6);
  auVar53 = vpmovsxbd_avx2(auVar42);
  auVar55 = vcvtdq2ps_avx(auVar55);
  auVar53 = vcvtdq2ps_avx(auVar53);
  auVar43._8_8_ = 0;
  auVar43._0_8_ = *(ulong *)(prim + uVar26 * 6 + 6);
  auVar60 = vpmovsxbd_avx2(auVar43);
  auVar60 = vcvtdq2ps_avx(auVar60);
  auVar44._8_8_ = 0;
  auVar44._0_8_ = *(ulong *)(prim + uVar26 * 0xb + 6);
  auVar70 = vpmovsxbd_avx2(auVar44);
  auVar38._8_8_ = 0;
  auVar38._0_8_ = *(ulong *)(prim + (ulong)((uint)(byte)PVar4 * 0xc) + 6);
  auVar64 = vpmovsxbd_avx2(auVar38);
  auVar70 = vcvtdq2ps_avx(auVar70);
  auVar71 = vcvtdq2ps_avx(auVar64);
  auVar34._8_8_ = 0;
  auVar34._0_8_ = *(ulong *)(prim + (uint)(byte)PVar4 * 0xc + uVar26 + 6);
  auVar54 = vpmovsxbd_avx2(auVar34);
  auVar54 = vcvtdq2ps_avx(auVar54);
  uVar29 = (ulong)(uint)((int)(uVar26 * 9) * 2);
  auVar33._8_8_ = 0;
  auVar33._0_8_ = *(ulong *)(prim + uVar29 + 6);
  auVar61 = vpmovsxbd_avx2(auVar33);
  auVar61 = vcvtdq2ps_avx(auVar61);
  auVar35._8_8_ = 0;
  auVar35._0_8_ = *(ulong *)(prim + uVar29 + uVar26 + 6);
  auVar62 = vpmovsxbd_avx2(auVar35);
  auVar62 = vcvtdq2ps_avx(auVar62);
  uVar25 = (ulong)(uint)((int)(uVar26 * 5) << 2);
  auVar36._8_8_ = 0;
  auVar36._0_8_ = *(ulong *)(prim + uVar25 + 6);
  auVar52 = vpmovsxbd_avx2(auVar36);
  auVar63 = vcvtdq2ps_avx(auVar52);
  auVar127._4_4_ = fVar89;
  auVar127._0_4_ = fVar89;
  auVar127._8_4_ = fVar89;
  auVar127._12_4_ = fVar89;
  auVar127._16_4_ = fVar89;
  auVar127._20_4_ = fVar89;
  auVar127._24_4_ = fVar89;
  auVar127._28_4_ = fVar89;
  auVar230._8_4_ = 1;
  auVar230._0_8_ = 0x100000001;
  auVar230._12_4_ = 1;
  auVar230._16_4_ = 1;
  auVar230._20_4_ = 1;
  auVar230._24_4_ = 1;
  auVar230._28_4_ = 1;
  auVar50 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar237 = ZEXT3264(auVar50);
  auVar66 = ZEXT1632(CONCAT412(fVar195 * (ray->super_RayK<1>).dir.field_0.m128[3],
                               CONCAT48(fVar195 * (ray->super_RayK<1>).dir.field_0.m128[2],
                                        CONCAT44(fVar195 * (ray->super_RayK<1>).dir.field_0.m128[1],
                                                 fVar89))));
  auVar65 = vpermps_avx2(auVar230,auVar66);
  auVar51 = vpermps_avx512vl(auVar50,auVar66);
  fVar89 = auVar51._0_4_;
  fVar190 = auVar51._4_4_;
  auVar66._4_4_ = fVar190 * auVar60._4_4_;
  auVar66._0_4_ = fVar89 * auVar60._0_4_;
  fVar191 = auVar51._8_4_;
  auVar66._8_4_ = fVar191 * auVar60._8_4_;
  fVar192 = auVar51._12_4_;
  auVar66._12_4_ = fVar192 * auVar60._12_4_;
  fVar193 = auVar51._16_4_;
  auVar66._16_4_ = fVar193 * auVar60._16_4_;
  fVar194 = auVar51._20_4_;
  auVar66._20_4_ = fVar194 * auVar60._20_4_;
  fVar95 = auVar51._24_4_;
  auVar66._24_4_ = fVar95 * auVar60._24_4_;
  auVar66._28_4_ = auVar64._28_4_;
  auVar64._4_4_ = auVar54._4_4_ * fVar190;
  auVar64._0_4_ = auVar54._0_4_ * fVar89;
  auVar64._8_4_ = auVar54._8_4_ * fVar191;
  auVar64._12_4_ = auVar54._12_4_ * fVar192;
  auVar64._16_4_ = auVar54._16_4_ * fVar193;
  auVar64._20_4_ = auVar54._20_4_ * fVar194;
  auVar64._24_4_ = auVar54._24_4_ * fVar95;
  auVar64._28_4_ = auVar52._28_4_;
  auVar52._4_4_ = auVar63._4_4_ * fVar190;
  auVar52._0_4_ = auVar63._0_4_ * fVar89;
  auVar52._8_4_ = auVar63._8_4_ * fVar191;
  auVar52._12_4_ = auVar63._12_4_ * fVar192;
  auVar52._16_4_ = auVar63._16_4_ * fVar193;
  auVar52._20_4_ = auVar63._20_4_ * fVar194;
  auVar52._24_4_ = auVar63._24_4_ * fVar95;
  auVar52._28_4_ = auVar51._28_4_;
  auVar32 = vfmadd231ps_fma(auVar66,auVar65,auVar53);
  auVar42 = vfmadd231ps_fma(auVar64,auVar65,auVar71);
  auVar43 = vfmadd231ps_fma(auVar52,auVar62,auVar65);
  auVar32 = vfmadd231ps_fma(ZEXT1632(auVar32),auVar127,auVar55);
  auVar42 = vfmadd231ps_fma(ZEXT1632(auVar42),auVar127,auVar70);
  auVar43 = vfmadd231ps_fma(ZEXT1632(auVar43),auVar61,auVar127);
  auVar221._4_4_ = fVar112;
  auVar221._0_4_ = fVar112;
  auVar221._8_4_ = fVar112;
  auVar221._12_4_ = fVar112;
  auVar221._16_4_ = fVar112;
  auVar221._20_4_ = fVar112;
  auVar221._24_4_ = fVar112;
  auVar221._28_4_ = fVar112;
  auVar52 = ZEXT1632(CONCAT412(fVar195 * auVar37._12_4_,
                               CONCAT48(fVar195 * auVar37._8_4_,
                                        CONCAT44(fVar195 * auVar37._4_4_,fVar112))));
  auVar64 = vpermps_avx2(auVar230,auVar52);
  auVar52 = vpermps_avx512vl(auVar50,auVar52);
  fVar195 = auVar52._0_4_;
  fVar89 = auVar52._4_4_;
  auVar65._4_4_ = fVar89 * auVar60._4_4_;
  auVar65._0_4_ = fVar195 * auVar60._0_4_;
  fVar190 = auVar52._8_4_;
  auVar65._8_4_ = fVar190 * auVar60._8_4_;
  fVar191 = auVar52._12_4_;
  auVar65._12_4_ = fVar191 * auVar60._12_4_;
  fVar192 = auVar52._16_4_;
  auVar65._16_4_ = fVar192 * auVar60._16_4_;
  fVar193 = auVar52._20_4_;
  auVar65._20_4_ = fVar193 * auVar60._20_4_;
  fVar194 = auVar52._24_4_;
  auVar65._24_4_ = fVar194 * auVar60._24_4_;
  auVar65._28_4_ = 1;
  auVar50._4_4_ = auVar54._4_4_ * fVar89;
  auVar50._0_4_ = auVar54._0_4_ * fVar195;
  auVar50._8_4_ = auVar54._8_4_ * fVar190;
  auVar50._12_4_ = auVar54._12_4_ * fVar191;
  auVar50._16_4_ = auVar54._16_4_ * fVar192;
  auVar50._20_4_ = auVar54._20_4_ * fVar193;
  auVar50._24_4_ = auVar54._24_4_ * fVar194;
  auVar50._28_4_ = auVar60._28_4_;
  auVar54._4_4_ = auVar63._4_4_ * fVar89;
  auVar54._0_4_ = auVar63._0_4_ * fVar195;
  auVar54._8_4_ = auVar63._8_4_ * fVar190;
  auVar54._12_4_ = auVar63._12_4_ * fVar191;
  auVar54._16_4_ = auVar63._16_4_ * fVar192;
  auVar54._20_4_ = auVar63._20_4_ * fVar193;
  auVar54._24_4_ = auVar63._24_4_ * fVar194;
  auVar54._28_4_ = auVar52._28_4_;
  auVar44 = vfmadd231ps_fma(auVar65,auVar64,auVar53);
  auVar38 = vfmadd231ps_fma(auVar50,auVar64,auVar71);
  auVar34 = vfmadd231ps_fma(auVar54,auVar64,auVar62);
  auVar44 = vfmadd231ps_fma(ZEXT1632(auVar44),auVar221,auVar55);
  auVar38 = vfmadd231ps_fma(ZEXT1632(auVar38),auVar221,auVar70);
  auVar73._8_4_ = 0x7fffffff;
  auVar73._0_8_ = 0x7fffffff7fffffff;
  auVar73._12_4_ = 0x7fffffff;
  auVar73._16_4_ = 0x7fffffff;
  auVar73._20_4_ = 0x7fffffff;
  auVar73._24_4_ = 0x7fffffff;
  auVar73._28_4_ = 0x7fffffff;
  auVar34 = vfmadd231ps_fma(ZEXT1632(auVar34),auVar221,auVar61);
  auVar55 = vandps_avx(ZEXT1632(auVar32),auVar73);
  auVar119._8_4_ = 0x219392ef;
  auVar119._0_8_ = 0x219392ef219392ef;
  auVar119._12_4_ = 0x219392ef;
  auVar119._16_4_ = 0x219392ef;
  auVar119._20_4_ = 0x219392ef;
  auVar119._24_4_ = 0x219392ef;
  auVar119._28_4_ = 0x219392ef;
  uVar29 = vcmpps_avx512vl(auVar55,auVar119,1);
  bVar10 = (bool)((byte)uVar29 & 1);
  auVar51._0_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar32._0_4_;
  bVar10 = (bool)((byte)(uVar29 >> 1) & 1);
  auVar51._4_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar32._4_4_;
  bVar10 = (bool)((byte)(uVar29 >> 2) & 1);
  auVar51._8_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar32._8_4_;
  bVar10 = (bool)((byte)(uVar29 >> 3) & 1);
  auVar51._12_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar32._12_4_;
  auVar51._16_4_ = (uint)((byte)(uVar29 >> 4) & 1) * 0x219392ef;
  auVar51._20_4_ = (uint)((byte)(uVar29 >> 5) & 1) * 0x219392ef;
  auVar51._24_4_ = (uint)((byte)(uVar29 >> 6) & 1) * 0x219392ef;
  auVar51._28_4_ = (uint)(byte)(uVar29 >> 7) * 0x219392ef;
  auVar55 = vandps_avx(ZEXT1632(auVar42),auVar73);
  uVar29 = vcmpps_avx512vl(auVar55,auVar119,1);
  bVar10 = (bool)((byte)uVar29 & 1);
  auVar67._0_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar42._0_4_;
  bVar10 = (bool)((byte)(uVar29 >> 1) & 1);
  auVar67._4_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar42._4_4_;
  bVar10 = (bool)((byte)(uVar29 >> 2) & 1);
  auVar67._8_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar42._8_4_;
  bVar10 = (bool)((byte)(uVar29 >> 3) & 1);
  auVar67._12_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar42._12_4_;
  auVar67._16_4_ = (uint)((byte)(uVar29 >> 4) & 1) * 0x219392ef;
  auVar67._20_4_ = (uint)((byte)(uVar29 >> 5) & 1) * 0x219392ef;
  auVar67._24_4_ = (uint)((byte)(uVar29 >> 6) & 1) * 0x219392ef;
  auVar67._28_4_ = (uint)(byte)(uVar29 >> 7) * 0x219392ef;
  auVar55 = vandps_avx(ZEXT1632(auVar43),auVar73);
  uVar29 = vcmpps_avx512vl(auVar55,auVar119,1);
  bVar10 = (bool)((byte)uVar29 & 1);
  auVar55._0_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar43._0_4_;
  bVar10 = (bool)((byte)(uVar29 >> 1) & 1);
  auVar55._4_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar43._4_4_;
  bVar10 = (bool)((byte)(uVar29 >> 2) & 1);
  auVar55._8_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar43._8_4_;
  bVar10 = (bool)((byte)(uVar29 >> 3) & 1);
  auVar55._12_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar43._12_4_;
  auVar55._16_4_ = (uint)((byte)(uVar29 >> 4) & 1) * 0x219392ef;
  auVar55._20_4_ = (uint)((byte)(uVar29 >> 5) & 1) * 0x219392ef;
  auVar55._24_4_ = (uint)((byte)(uVar29 >> 6) & 1) * 0x219392ef;
  auVar55._28_4_ = (uint)(byte)(uVar29 >> 7) * 0x219392ef;
  auVar53 = vrcp14ps_avx512vl(auVar51);
  auVar74._8_4_ = 0x3f800000;
  auVar74._0_8_ = &DAT_3f8000003f800000;
  auVar74._12_4_ = 0x3f800000;
  auVar74._16_4_ = 0x3f800000;
  auVar74._20_4_ = 0x3f800000;
  auVar74._24_4_ = 0x3f800000;
  auVar74._28_4_ = 0x3f800000;
  auVar32 = vfnmadd213ps_fma(auVar51,auVar53,auVar74);
  auVar32 = vfmadd132ps_fma(ZEXT1632(auVar32),auVar53,auVar53);
  auVar53 = vrcp14ps_avx512vl(auVar67);
  auVar42 = vfnmadd213ps_fma(auVar67,auVar53,auVar74);
  auVar42 = vfmadd132ps_fma(ZEXT1632(auVar42),auVar53,auVar53);
  auVar53 = vrcp14ps_avx512vl(auVar55);
  auVar43 = vfnmadd213ps_fma(auVar55,auVar53,auVar74);
  auVar43 = vfmadd132ps_fma(ZEXT1632(auVar43),auVar53,auVar53);
  auVar55 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar26 * 7 + 6));
  auVar55 = vcvtdq2ps_avx(auVar55);
  auVar55 = vsubps_avx(auVar55,ZEXT1632(auVar44));
  auVar61._4_4_ = auVar32._4_4_ * auVar55._4_4_;
  auVar61._0_4_ = auVar32._0_4_ * auVar55._0_4_;
  auVar61._8_4_ = auVar32._8_4_ * auVar55._8_4_;
  auVar61._12_4_ = auVar32._12_4_ * auVar55._12_4_;
  auVar61._16_4_ = auVar55._16_4_ * 0.0;
  auVar61._20_4_ = auVar55._20_4_ * 0.0;
  auVar61._24_4_ = auVar55._24_4_ * 0.0;
  auVar61._28_4_ = auVar55._28_4_;
  auVar55 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar26 * 9 + 6));
  auVar55 = vcvtdq2ps_avx(auVar55);
  auVar55 = vsubps_avx(auVar55,ZEXT1632(auVar44));
  auVar54 = vpbroadcastd_avx512vl();
  auVar53 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + (ulong)(byte)PVar4 * 0x10 + 6));
  auVar72._0_4_ = auVar32._0_4_ * auVar55._0_4_;
  auVar72._4_4_ = auVar32._4_4_ * auVar55._4_4_;
  auVar72._8_4_ = auVar32._8_4_ * auVar55._8_4_;
  auVar72._12_4_ = auVar32._12_4_ * auVar55._12_4_;
  auVar72._16_4_ = auVar55._16_4_ * 0.0;
  auVar72._20_4_ = auVar55._20_4_ * 0.0;
  auVar72._24_4_ = auVar55._24_4_ * 0.0;
  auVar72._28_4_ = 0;
  auVar55 = vpmovsxwd_avx2(*(undefined1 (*) [16])
                            (prim + (ulong)(byte)PVar4 * 0x10 + uVar26 * -2 + 6));
  auVar55 = vcvtdq2ps_avx(auVar55);
  auVar55 = vsubps_avx(auVar55,ZEXT1632(auVar38));
  auVar62._4_4_ = auVar42._4_4_ * auVar55._4_4_;
  auVar62._0_4_ = auVar42._0_4_ * auVar55._0_4_;
  auVar62._8_4_ = auVar42._8_4_ * auVar55._8_4_;
  auVar62._12_4_ = auVar42._12_4_ * auVar55._12_4_;
  auVar62._16_4_ = auVar55._16_4_ * 0.0;
  auVar62._20_4_ = auVar55._20_4_ * 0.0;
  auVar62._24_4_ = auVar55._24_4_ * 0.0;
  auVar62._28_4_ = auVar55._28_4_;
  auVar55 = vcvtdq2ps_avx(auVar53);
  auVar55 = vsubps_avx(auVar55,ZEXT1632(auVar38));
  auVar69._0_4_ = auVar42._0_4_ * auVar55._0_4_;
  auVar69._4_4_ = auVar42._4_4_ * auVar55._4_4_;
  auVar69._8_4_ = auVar42._8_4_ * auVar55._8_4_;
  auVar69._12_4_ = auVar42._12_4_ * auVar55._12_4_;
  auVar69._16_4_ = auVar55._16_4_ * 0.0;
  auVar69._20_4_ = auVar55._20_4_ * 0.0;
  auVar69._24_4_ = auVar55._24_4_ * 0.0;
  auVar69._28_4_ = 0;
  auVar55 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar25 + uVar26 + 6));
  auVar55 = vcvtdq2ps_avx(auVar55);
  auVar55 = vsubps_avx(auVar55,ZEXT1632(auVar34));
  auVar63._4_4_ = auVar55._4_4_ * auVar43._4_4_;
  auVar63._0_4_ = auVar55._0_4_ * auVar43._0_4_;
  auVar63._8_4_ = auVar55._8_4_ * auVar43._8_4_;
  auVar63._12_4_ = auVar55._12_4_ * auVar43._12_4_;
  auVar63._16_4_ = auVar55._16_4_ * 0.0;
  auVar63._20_4_ = auVar55._20_4_ * 0.0;
  auVar63._24_4_ = auVar55._24_4_ * 0.0;
  auVar63._28_4_ = auVar55._28_4_;
  auVar55 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar26 * 0x17 + 6));
  auVar55 = vcvtdq2ps_avx(auVar55);
  auVar55 = vsubps_avx(auVar55,ZEXT1632(auVar34));
  auVar68._0_4_ = auVar43._0_4_ * auVar55._0_4_;
  auVar68._4_4_ = auVar43._4_4_ * auVar55._4_4_;
  auVar68._8_4_ = auVar43._8_4_ * auVar55._8_4_;
  auVar68._12_4_ = auVar43._12_4_ * auVar55._12_4_;
  auVar68._16_4_ = auVar55._16_4_ * 0.0;
  auVar68._20_4_ = auVar55._20_4_ * 0.0;
  auVar68._24_4_ = auVar55._24_4_ * 0.0;
  auVar68._28_4_ = 0;
  auVar55 = vpminsd_avx2(auVar61,auVar72);
  auVar53 = vpminsd_avx2(auVar62,auVar69);
  auVar55 = vmaxps_avx(auVar55,auVar53);
  auVar53 = vpminsd_avx2(auVar63,auVar68);
  uVar90 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
  auVar60._4_4_ = uVar90;
  auVar60._0_4_ = uVar90;
  auVar60._8_4_ = uVar90;
  auVar60._12_4_ = uVar90;
  auVar60._16_4_ = uVar90;
  auVar60._20_4_ = uVar90;
  auVar60._24_4_ = uVar90;
  auVar60._28_4_ = uVar90;
  auVar53 = vmaxps_avx512vl(auVar53,auVar60);
  auVar55 = vmaxps_avx(auVar55,auVar53);
  auVar53._8_4_ = 0x3f7ffffa;
  auVar53._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar53._12_4_ = 0x3f7ffffa;
  auVar53._16_4_ = 0x3f7ffffa;
  auVar53._20_4_ = 0x3f7ffffa;
  auVar53._24_4_ = 0x3f7ffffa;
  auVar53._28_4_ = 0x3f7ffffa;
  local_b8 = vmulps_avx512vl(auVar55,auVar53);
  auVar55 = vpmaxsd_avx2(auVar61,auVar72);
  auVar53 = vpmaxsd_avx2(auVar62,auVar69);
  auVar55 = vminps_avx(auVar55,auVar53);
  auVar53 = vpmaxsd_avx2(auVar63,auVar68);
  fVar195 = (ray->super_RayK<1>).tfar;
  auVar70._4_4_ = fVar195;
  auVar70._0_4_ = fVar195;
  auVar70._8_4_ = fVar195;
  auVar70._12_4_ = fVar195;
  auVar70._16_4_ = fVar195;
  auVar70._20_4_ = fVar195;
  auVar70._24_4_ = fVar195;
  auVar70._28_4_ = fVar195;
  auVar53 = vminps_avx512vl(auVar53,auVar70);
  auVar55 = vminps_avx(auVar55,auVar53);
  auVar71._8_4_ = 0x3f800003;
  auVar71._0_8_ = 0x3f8000033f800003;
  auVar71._12_4_ = 0x3f800003;
  auVar71._16_4_ = 0x3f800003;
  auVar71._20_4_ = 0x3f800003;
  auVar71._24_4_ = 0x3f800003;
  auVar71._28_4_ = 0x3f800003;
  auVar55 = vmulps_avx512vl(auVar55,auVar71);
  uVar13 = vpcmpgtd_avx512vl(auVar54,_DAT_0205a920);
  uVar12 = vcmpps_avx512vl(local_b8,auVar55,2);
  if ((byte)((byte)uVar12 & (byte)uVar13) == 0) {
    return;
  }
  local_360 = (ulong)(byte)((byte)uVar12 & (byte)uVar13);
  auVar87._16_16_ = auVar55._16_16_;
  auVar32 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
  auVar241 = ZEXT1664(auVar32);
  auVar32 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
  auVar232 = ZEXT1664(auVar32);
  auVar87._0_16_ = vbroadcastss_avx512vl(ZEXT416(0x80000000));
  auVar233 = ZEXT1664(auVar87._0_16_);
  local_328 = prim;
LAB_01d94176:
  lVar30 = 0;
  for (uVar29 = local_360; (uVar29 & 1) == 0; uVar29 = uVar29 >> 1 | 0x8000000000000000) {
    lVar30 = lVar30 + 1;
  }
  uVar31 = *(uint *)(local_328 + 2);
  pGVar6 = (context->scene->geometries).items[uVar31].ptr;
  local_320 = (ulong)*(uint *)(local_328 + lVar30 * 4 + 6);
  lVar7 = *(long *)&pGVar6[1].time_range.upper;
  uVar29 = (ulong)*(uint *)(*(long *)&pGVar6->field_0x58 +
                           (ulong)*(uint *)(local_328 + lVar30 * 4 + 6) *
                           pGVar6[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  auVar32 = *(undefined1 (*) [16])(lVar7 + (long)pGVar6[1].intersectionFilterN * uVar29);
  lVar30 = uVar29 + 1;
  auVar42 = *(undefined1 (*) [16])(lVar7 + (long)pGVar6[1].intersectionFilterN * lVar30);
  _Var8 = pGVar6[2].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  auVar43 = *(undefined1 (*) [16])(_Var8 + (long)pGVar6[2].userPtr * uVar29);
  auVar44 = *(undefined1 (*) [16])(_Var8 + (long)pGVar6[2].userPtr * lVar30);
  auVar57._16_16_ = auVar87._16_16_;
  auVar33 = vbroadcastss_avx512vl(ZEXT416(0x3eaaaaab));
  auVar34 = vfmadd132ps_avx512vl
                      (*(undefined1 (*) [16])
                        (pGVar6[2].intersectionFilterN + (long)pGVar6[2].pointQueryFunc * uVar29),
                       auVar32,auVar33);
  auVar35 = vfnmadd132ps_avx512vl
                      (*(undefined1 (*) [16])
                        (pGVar6[2].intersectionFilterN + (long)pGVar6[2].pointQueryFunc * lVar30),
                       auVar42,auVar33);
  auVar36 = vfmadd132ps_avx512vl
                      (*(undefined1 (*) [16])
                        ((long)pGVar6[3].userPtr + uVar29 * *(long *)&pGVar6[3].fnumTimeSegments),
                       auVar43,auVar33);
  auVar37 = vfnmadd132ps_avx512vl
                      (*(undefined1 (*) [16])
                        ((long)pGVar6[3].userPtr + *(long *)&pGVar6[3].fnumTimeSegments * lVar30),
                       auVar44,auVar33);
  auVar57._0_16_ = vxorps_avx512vl(in_ZMM19._0_16_,in_ZMM19._0_16_);
  auVar38 = vmulps_avx512vl(auVar42,auVar57._0_16_);
  auVar39 = vfmadd231ps_avx512vl(auVar38,auVar35,auVar57._0_16_);
  auVar38 = vfmadd213ps_fma(ZEXT816(0) << 0x40,auVar34,auVar39);
  auVar47._0_4_ = auVar32._0_4_ + auVar38._0_4_;
  auVar47._4_4_ = auVar32._4_4_ + auVar38._4_4_;
  auVar47._8_4_ = auVar32._8_4_ + auVar38._8_4_;
  auVar47._12_4_ = auVar32._12_4_ + auVar38._12_4_;
  auVar49 = auVar241._0_16_;
  auVar38 = vfmadd231ps_avx512vl(auVar39,auVar34,auVar49);
  auVar39 = vfnmadd231ps_avx512vl(auVar38,auVar32,auVar49);
  auVar38 = vmulps_avx512vl(auVar44,auVar57._0_16_);
  auVar40 = vfmadd231ps_avx512vl(auVar38,auVar37,auVar57._0_16_);
  auVar38 = vfmadd213ps_fma(ZEXT816(0) << 0x40,auVar36,auVar40);
  auVar209._0_4_ = auVar43._0_4_ + auVar38._0_4_;
  auVar209._4_4_ = auVar43._4_4_ + auVar38._4_4_;
  auVar209._8_4_ = auVar43._8_4_ + auVar38._8_4_;
  auVar209._12_4_ = auVar43._12_4_ + auVar38._12_4_;
  auVar38 = vfmadd231ps_avx512vl(auVar40,auVar36,auVar49);
  auVar40 = vfnmadd231ps_avx512vl(auVar38,auVar43,auVar49);
  auVar38 = vfmadd213ps_fma(ZEXT816(0) << 0x20,auVar35,auVar42);
  auVar38 = vfmadd231ps_avx512vl(auVar38,auVar34,auVar57._0_16_);
  auVar41 = vfmadd231ps_avx512vl(auVar38,auVar32,auVar57._0_16_);
  auVar42 = vmulps_avx512vl(auVar42,auVar49);
  auVar42 = vfnmadd231ps_avx512vl(auVar42,auVar49,auVar35);
  auVar42 = vfmadd231ps_avx512vl(auVar42,auVar57._0_16_,auVar34);
  auVar35 = vfnmadd231ps_avx512vl(auVar42,auVar57._0_16_,auVar32);
  auVar32 = vfmadd213ps_fma(ZEXT816(0) << 0x20,auVar37,auVar44);
  auVar32 = vfmadd231ps_avx512vl(auVar32,auVar36,auVar57._0_16_);
  auVar38 = vfmadd231ps_avx512vl(auVar32,auVar43,auVar57._0_16_);
  auVar32 = vmulps_avx512vl(auVar44,auVar49);
  auVar32 = vfnmadd231ps_avx512vl(auVar32,auVar49,auVar37);
  auVar32 = vfmadd231ps_avx512vl(auVar32,auVar57._0_16_,auVar36);
  auVar34 = vfnmadd231ps_avx512vl(auVar32,auVar57._0_16_,auVar43);
  auVar32 = vshufps_avx(auVar39,auVar39,0xc9);
  auVar42 = vshufps_avx(auVar209,auVar209,0xc9);
  fVar112 = auVar39._0_4_;
  auVar138._0_4_ = fVar112 * auVar42._0_4_;
  fVar92 = auVar39._4_4_;
  auVar138._4_4_ = fVar92 * auVar42._4_4_;
  fVar93 = auVar39._8_4_;
  auVar138._8_4_ = fVar93 * auVar42._8_4_;
  fVar94 = auVar39._12_4_;
  auVar138._12_4_ = fVar94 * auVar42._12_4_;
  auVar42 = vfmsub231ps_fma(auVar138,auVar32,auVar209);
  auVar43 = vshufps_avx(auVar42,auVar42,0xc9);
  auVar42 = vshufps_avx(auVar40,auVar40,0xc9);
  auVar159._0_4_ = auVar42._0_4_ * fVar112;
  auVar159._4_4_ = auVar42._4_4_ * fVar92;
  auVar159._8_4_ = auVar42._8_4_ * fVar93;
  auVar159._12_4_ = auVar42._12_4_ * fVar94;
  auVar32 = vfmsub231ps_fma(auVar159,auVar32,auVar40);
  auVar44 = vshufps_avx(auVar32,auVar32,0xc9);
  auVar32 = vshufps_avx(auVar35,auVar35,0xc9);
  auVar42 = vshufps_avx(auVar38,auVar38,0xc9);
  fVar195 = auVar35._0_4_;
  auVar170._0_4_ = auVar42._0_4_ * fVar195;
  fVar89 = auVar35._4_4_;
  auVar170._4_4_ = auVar42._4_4_ * fVar89;
  fVar190 = auVar35._8_4_;
  auVar170._8_4_ = auVar42._8_4_ * fVar190;
  fVar191 = auVar35._12_4_;
  auVar170._12_4_ = auVar42._12_4_ * fVar191;
  auVar42 = vfmsub231ps_fma(auVar170,auVar32,auVar38);
  auVar38 = vshufps_avx(auVar42,auVar42,0xc9);
  auVar42 = vshufps_avx(auVar34,auVar34,0xc9);
  auVar171._0_4_ = auVar42._0_4_ * fVar195;
  auVar171._4_4_ = auVar42._4_4_ * fVar89;
  auVar171._8_4_ = auVar42._8_4_ * fVar190;
  auVar171._12_4_ = auVar42._12_4_ * fVar191;
  auVar32 = vfmsub231ps_fma(auVar171,auVar32,auVar34);
  auVar34 = vshufps_avx(auVar32,auVar32,0xc9);
  auVar32 = vdpps_avx(auVar43,auVar43,0x7f);
  fVar192 = auVar32._0_4_;
  auVar56._4_28_ = auVar57._4_28_;
  auVar56._0_4_ = fVar192;
  auVar42 = vrsqrt14ss_avx512f(auVar57._0_16_,auVar56._0_16_);
  fVar193 = auVar42._0_4_;
  fVar194 = fVar193 * 1.5 - fVar192 * 0.5 * fVar193 * fVar193 * fVar193;
  auVar42 = vdpps_avx(auVar43,auVar44,0x7f);
  fVar208 = fVar194 * auVar43._0_4_;
  fVar215 = fVar194 * auVar43._4_4_;
  fVar216 = fVar194 * auVar43._8_4_;
  fVar217 = fVar194 * auVar43._12_4_;
  auVar160._0_4_ = fVar192 * auVar44._0_4_;
  auVar160._4_4_ = fVar192 * auVar44._4_4_;
  auVar160._8_4_ = fVar192 * auVar44._8_4_;
  auVar160._12_4_ = fVar192 * auVar44._12_4_;
  fVar192 = auVar42._0_4_;
  auVar139._0_4_ = fVar192 * auVar43._0_4_;
  auVar139._4_4_ = fVar192 * auVar43._4_4_;
  auVar139._8_4_ = fVar192 * auVar43._8_4_;
  auVar139._12_4_ = fVar192 * auVar43._12_4_;
  auVar43 = vsubps_avx(auVar160,auVar139);
  auVar42 = vrcp14ss_avx512f(auVar57._0_16_,auVar56._0_16_);
  auVar32 = vfnmadd213ss_avx512f(auVar32,auVar42,ZEXT416(0x40000000));
  fVar192 = auVar42._0_4_ * auVar32._0_4_;
  auVar32 = vdpps_avx(auVar38,auVar38,0x7f);
  fVar193 = auVar32._0_4_;
  auVar59._16_16_ = auVar57._16_16_;
  auVar59._0_16_ = auVar57._0_16_;
  auVar58._4_28_ = auVar59._4_28_;
  auVar58._0_4_ = fVar193;
  auVar42 = vrsqrt14ss_avx512f(auVar57._0_16_,auVar58._0_16_);
  fVar95 = auVar42._0_4_;
  fVar95 = fVar95 * 1.5 - fVar193 * 0.5 * fVar95 * fVar95 * fVar95;
  auVar42 = vdpps_avx(auVar38,auVar34,0x7f);
  fVar196 = fVar95 * auVar38._0_4_;
  fVar205 = fVar95 * auVar38._4_4_;
  fVar206 = fVar95 * auVar38._8_4_;
  fVar207 = fVar95 * auVar38._12_4_;
  auVar129._0_4_ = fVar193 * auVar34._0_4_;
  auVar129._4_4_ = fVar193 * auVar34._4_4_;
  auVar129._8_4_ = fVar193 * auVar34._8_4_;
  auVar129._12_4_ = fVar193 * auVar34._12_4_;
  fVar193 = auVar42._0_4_;
  auVar48._0_4_ = fVar193 * auVar38._0_4_;
  auVar48._4_4_ = fVar193 * auVar38._4_4_;
  auVar48._8_4_ = fVar193 * auVar38._8_4_;
  auVar48._12_4_ = fVar193 * auVar38._12_4_;
  auVar44 = vsubps_avx(auVar129,auVar48);
  auVar42 = vrcp14ss_avx512f(auVar57._0_16_,auVar58._0_16_);
  auVar32 = vfnmadd213ss_avx512f(auVar32,auVar42,ZEXT416(0x40000000));
  fVar193 = auVar42._0_4_ * auVar32._0_4_;
  auVar32 = vshufps_avx(auVar47,auVar47,0xff);
  auVar147._0_4_ = fVar208 * auVar32._0_4_;
  auVar147._4_4_ = fVar215 * auVar32._4_4_;
  auVar147._8_4_ = fVar216 * auVar32._8_4_;
  auVar147._12_4_ = fVar217 * auVar32._12_4_;
  local_218 = vsubps_avx(auVar47,auVar147);
  auVar42 = vshufps_avx(auVar39,auVar39,0xff);
  auVar130._0_4_ = auVar42._0_4_ * fVar208 + auVar32._0_4_ * fVar194 * fVar192 * auVar43._0_4_;
  auVar130._4_4_ = auVar42._4_4_ * fVar215 + auVar32._4_4_ * fVar194 * fVar192 * auVar43._4_4_;
  auVar130._8_4_ = auVar42._8_4_ * fVar216 + auVar32._8_4_ * fVar194 * fVar192 * auVar43._8_4_;
  auVar130._12_4_ = auVar42._12_4_ * fVar217 + auVar32._12_4_ * fVar194 * fVar192 * auVar43._12_4_;
  auVar43 = vsubps_avx(auVar39,auVar130);
  local_228._0_4_ = auVar47._0_4_ + auVar147._0_4_;
  local_228._4_4_ = auVar47._4_4_ + auVar147._4_4_;
  fStack_220 = auVar47._8_4_ + auVar147._8_4_;
  fStack_21c = auVar47._12_4_ + auVar147._12_4_;
  auVar37._0_4_ = fVar112 + auVar130._0_4_;
  auVar37._4_4_ = fVar92 + auVar130._4_4_;
  auVar37._8_4_ = fVar93 + auVar130._8_4_;
  auVar37._12_4_ = fVar94 + auVar130._12_4_;
  auVar32 = vshufps_avx(auVar41,auVar41,0xff);
  auVar131._0_4_ = fVar196 * auVar32._0_4_;
  auVar131._4_4_ = fVar205 * auVar32._4_4_;
  auVar131._8_4_ = fVar206 * auVar32._8_4_;
  auVar131._12_4_ = fVar207 * auVar32._12_4_;
  local_238 = vsubps_avx(auVar41,auVar131);
  auVar42 = vshufps_avx(auVar35,auVar35,0xff);
  auVar40._0_4_ = fVar196 * auVar42._0_4_ + auVar32._0_4_ * fVar95 * auVar44._0_4_ * fVar193;
  auVar40._4_4_ = fVar205 * auVar42._4_4_ + auVar32._4_4_ * fVar95 * auVar44._4_4_ * fVar193;
  auVar40._8_4_ = fVar206 * auVar42._8_4_ + auVar32._8_4_ * fVar95 * auVar44._8_4_ * fVar193;
  auVar40._12_4_ = fVar207 * auVar42._12_4_ + auVar32._12_4_ * fVar95 * auVar44._12_4_ * fVar193;
  auVar32 = vsubps_avx(auVar35,auVar40);
  _local_248 = vaddps_avx512vl(auVar41,auVar131);
  auVar41._0_4_ = fVar195 + auVar40._0_4_;
  auVar41._4_4_ = fVar89 + auVar40._4_4_;
  auVar41._8_4_ = fVar190 + auVar40._8_4_;
  auVar41._12_4_ = fVar191 + auVar40._12_4_;
  auVar42 = vmulps_avx512vl(auVar43,auVar33);
  local_258 = vaddps_avx512vl(local_218,auVar42);
  auVar32 = vmulps_avx512vl(auVar32,auVar33);
  local_268 = vsubps_avx512vl(local_238,auVar32);
  auVar32 = vmulps_avx512vl(auVar37,auVar33);
  _local_278 = vaddps_avx512vl(_local_228,auVar32);
  auVar32 = vmulps_avx512vl(auVar41,auVar33);
  _local_288 = vsubps_avx512vl(_local_248,auVar32);
  aVar1 = (ray->super_RayK<1>).org.field_0;
  auVar42 = vsubps_avx(local_218,(undefined1  [16])aVar1);
  uVar90 = auVar42._0_4_;
  auVar49._4_4_ = uVar90;
  auVar49._0_4_ = uVar90;
  auVar49._8_4_ = uVar90;
  auVar49._12_4_ = uVar90;
  auVar32 = vshufps_avx(auVar42,auVar42,0x55);
  auVar42 = vshufps_avx(auVar42,auVar42,0xaa);
  aVar2 = (pre->ray_space).vx.field_0;
  aVar3 = (pre->ray_space).vy.field_0;
  fVar195 = (pre->ray_space).vz.field_0.m128[0];
  fVar89 = (pre->ray_space).vz.field_0.m128[1];
  fVar190 = (pre->ray_space).vz.field_0.m128[2];
  fVar191 = (pre->ray_space).vz.field_0.m128[3];
  auVar39._0_4_ = fVar195 * auVar42._0_4_;
  auVar39._4_4_ = fVar89 * auVar42._4_4_;
  auVar39._8_4_ = fVar190 * auVar42._8_4_;
  auVar39._12_4_ = fVar191 * auVar42._12_4_;
  auVar32 = vfmadd231ps_fma(auVar39,(undefined1  [16])aVar3,auVar32);
  auVar38 = vfmadd231ps_fma(auVar32,(undefined1  [16])aVar2,auVar49);
  auVar42 = vsubps_avx512vl(local_258,(undefined1  [16])aVar1);
  uVar90 = auVar42._0_4_;
  auVar45._4_4_ = uVar90;
  auVar45._0_4_ = uVar90;
  auVar45._8_4_ = uVar90;
  auVar45._12_4_ = uVar90;
  auVar32 = vshufps_avx(auVar42,auVar42,0x55);
  auVar42 = vshufps_avx(auVar42,auVar42,0xaa);
  auVar96._0_4_ = fVar195 * auVar42._0_4_;
  auVar96._4_4_ = fVar89 * auVar42._4_4_;
  auVar96._8_4_ = fVar190 * auVar42._8_4_;
  auVar96._12_4_ = fVar191 * auVar42._12_4_;
  auVar32 = vfmadd231ps_fma(auVar96,(undefined1  [16])aVar3,auVar32);
  auVar34 = vfmadd231ps_fma(auVar32,(undefined1  [16])aVar2,auVar45);
  auVar42 = vsubps_avx512vl(local_268,(undefined1  [16])aVar1);
  uVar90 = auVar42._0_4_;
  auVar140._4_4_ = uVar90;
  auVar140._0_4_ = uVar90;
  auVar140._8_4_ = uVar90;
  auVar140._12_4_ = uVar90;
  auVar32 = vshufps_avx(auVar42,auVar42,0x55);
  auVar42 = vshufps_avx(auVar42,auVar42,0xaa);
  auVar46._0_4_ = fVar195 * auVar42._0_4_;
  auVar46._4_4_ = fVar89 * auVar42._4_4_;
  auVar46._8_4_ = fVar190 * auVar42._8_4_;
  auVar46._12_4_ = fVar191 * auVar42._12_4_;
  auVar32 = vfmadd231ps_fma(auVar46,(undefined1  [16])aVar3,auVar32);
  auVar33 = vfmadd231ps_fma(auVar32,(undefined1  [16])aVar2,auVar140);
  auVar42 = vsubps_avx(local_238,(undefined1  [16])aVar1);
  uVar90 = auVar42._0_4_;
  auVar161._4_4_ = uVar90;
  auVar161._0_4_ = uVar90;
  auVar161._8_4_ = uVar90;
  auVar161._12_4_ = uVar90;
  auVar32 = vshufps_avx(auVar42,auVar42,0x55);
  auVar42 = vshufps_avx(auVar42,auVar42,0xaa);
  auVar141._0_4_ = fVar195 * auVar42._0_4_;
  auVar141._4_4_ = fVar89 * auVar42._4_4_;
  auVar141._8_4_ = fVar190 * auVar42._8_4_;
  auVar141._12_4_ = fVar191 * auVar42._12_4_;
  auVar32 = vfmadd231ps_fma(auVar141,(undefined1  [16])aVar3,auVar32);
  auVar35 = vfmadd231ps_fma(auVar32,(undefined1  [16])aVar2,auVar161);
  auVar42 = vsubps_avx(_local_228,(undefined1  [16])aVar1);
  uVar90 = auVar42._0_4_;
  auVar172._4_4_ = uVar90;
  auVar172._0_4_ = uVar90;
  auVar172._8_4_ = uVar90;
  auVar172._12_4_ = uVar90;
  auVar32 = vshufps_avx(auVar42,auVar42,0x55);
  auVar42 = vshufps_avx(auVar42,auVar42,0xaa);
  auVar162._0_4_ = auVar42._0_4_ * fVar195;
  auVar162._4_4_ = auVar42._4_4_ * fVar89;
  auVar162._8_4_ = auVar42._8_4_ * fVar190;
  auVar162._12_4_ = auVar42._12_4_ * fVar191;
  auVar32 = vfmadd231ps_fma(auVar162,(undefined1  [16])aVar3,auVar32);
  auVar36 = vfmadd231ps_fma(auVar32,(undefined1  [16])aVar2,auVar172);
  auVar42 = vsubps_avx512vl(_local_278,(undefined1  [16])aVar1);
  uVar90 = auVar42._0_4_;
  auVar180._4_4_ = uVar90;
  auVar180._0_4_ = uVar90;
  auVar180._8_4_ = uVar90;
  auVar180._12_4_ = uVar90;
  auVar32 = vshufps_avx(auVar42,auVar42,0x55);
  auVar42 = vshufps_avx(auVar42,auVar42,0xaa);
  auVar173._0_4_ = auVar42._0_4_ * fVar195;
  auVar173._4_4_ = auVar42._4_4_ * fVar89;
  auVar173._8_4_ = auVar42._8_4_ * fVar190;
  auVar173._12_4_ = auVar42._12_4_ * fVar191;
  auVar32 = vfmadd231ps_fma(auVar173,(undefined1  [16])aVar3,auVar32);
  auVar37 = vfmadd231ps_fma(auVar32,(undefined1  [16])aVar2,auVar180);
  auVar42 = vsubps_avx512vl(_local_288,(undefined1  [16])aVar1);
  uVar90 = auVar42._0_4_;
  auVar197._4_4_ = uVar90;
  auVar197._0_4_ = uVar90;
  auVar197._8_4_ = uVar90;
  auVar197._12_4_ = uVar90;
  auVar32 = vshufps_avx(auVar42,auVar42,0x55);
  auVar42 = vshufps_avx(auVar42,auVar42,0xaa);
  auVar181._0_4_ = auVar42._0_4_ * fVar195;
  auVar181._4_4_ = auVar42._4_4_ * fVar89;
  auVar181._8_4_ = auVar42._8_4_ * fVar190;
  auVar181._12_4_ = auVar42._12_4_ * fVar191;
  auVar32 = vfmadd231ps_fma(auVar181,(undefined1  [16])aVar3,auVar32);
  auVar39 = vfmadd231ps_fma(auVar32,(undefined1  [16])aVar2,auVar197);
  auVar42 = vsubps_avx512vl(_local_248,(undefined1  [16])aVar1);
  uVar90 = auVar42._0_4_;
  auVar198._4_4_ = uVar90;
  auVar198._0_4_ = uVar90;
  auVar198._8_4_ = uVar90;
  auVar198._12_4_ = uVar90;
  auVar32 = vshufps_avx(auVar42,auVar42,0x55);
  auVar42 = vshufps_avx(auVar42,auVar42,0xaa);
  auVar122._0_4_ = fVar195 * auVar42._0_4_;
  auVar122._4_4_ = fVar89 * auVar42._4_4_;
  auVar122._8_4_ = fVar190 * auVar42._8_4_;
  auVar122._12_4_ = fVar191 * auVar42._12_4_;
  auVar32 = vfmadd231ps_fma(auVar122,(undefined1  [16])aVar3,auVar32);
  auVar40 = vfmadd231ps_fma(auVar32,(undefined1  [16])aVar2,auVar198);
  local_358 = vmovlhps_avx512f(auVar38,auVar36);
  auVar239 = ZEXT1664(local_358);
  local_2e8 = vmovlhps_avx(auVar34,auVar37);
  local_2f8 = vmovlhps_avx512f(auVar33,auVar39);
  _local_1f8 = vmovlhps_avx512f(auVar35,auVar40);
  auVar32 = vminps_avx512vl(local_358,local_2e8);
  auVar43 = vmaxps_avx512vl(local_358,local_2e8);
  auVar42 = vminps_avx512vl(local_2f8,_local_1f8);
  auVar42 = vminps_avx(auVar32,auVar42);
  auVar32 = vmaxps_avx512vl(local_2f8,_local_1f8);
  auVar32 = vmaxps_avx(auVar43,auVar32);
  auVar43 = vshufpd_avx(auVar42,auVar42,3);
  auVar44 = vshufpd_avx(auVar32,auVar32,3);
  auVar42 = vminps_avx(auVar42,auVar43);
  auVar32 = vmaxps_avx(auVar32,auVar44);
  auVar42 = vandps_avx512vl(auVar42,auVar232._0_16_);
  auVar32 = vandps_avx512vl(auVar32,auVar232._0_16_);
  auVar32 = vmaxps_avx(auVar42,auVar32);
  auVar42 = vmovshdup_avx(auVar32);
  auVar32 = vmaxss_avx(auVar42,auVar32);
  local_330 = local_360 + 0xff;
  local_178._8_8_ = auVar38._0_8_;
  local_178._0_8_ = auVar38._0_8_;
  local_188._8_8_ = auVar34._0_8_;
  local_188._0_8_ = auVar34._0_8_;
  local_198 = vmovddup_avx512vl(auVar33);
  local_1a8._0_8_ = auVar35._0_8_;
  local_1a8._8_8_ = local_1a8._0_8_;
  register0x00001348 = auVar36._0_8_;
  local_1b8 = auVar36._0_8_;
  register0x00001408 = auVar37._0_8_;
  local_1c8 = auVar37._0_8_;
  register0x00001448 = auVar39._0_8_;
  local_1d8 = auVar39._0_8_;
  register0x00001488 = auVar40._0_8_;
  local_1e8 = auVar40._0_8_;
  local_208 = ZEXT416((uint)(auVar32._0_4_ * 9.536743e-07));
  local_78 = vbroadcastss_avx512vl(local_208);
  auVar32 = vxorps_avx512vl(local_78._0_16_,auVar233._0_16_);
  local_98 = vbroadcastss_avx512vl(auVar32);
  local_308 = vsubps_avx512vl(local_2e8,local_358);
  local_318 = vsubps_avx512vl(local_2f8,local_2e8);
  local_e8 = vsubps_avx512vl(_local_1f8,local_2f8);
  local_f8 = vsubps_avx(_local_228,local_218);
  local_108 = vsubps_avx512vl(_local_278,local_258);
  local_118 = vsubps_avx512vl(_local_288,local_268);
  _local_128 = vsubps_avx512vl(_local_248,local_238);
  uVar29 = 0;
  auVar32 = ZEXT816(0x3f80000000000000);
  auVar229 = ZEXT1664(auVar32);
  do {
    auVar36 = auVar229._0_16_;
    auVar236 = ZEXT1664(auVar36);
    auVar42 = vshufps_avx(auVar36,auVar36,0x50);
    auVar218._8_4_ = 0x3f800000;
    auVar218._0_8_ = &DAT_3f8000003f800000;
    auVar218._12_4_ = 0x3f800000;
    auVar222._16_4_ = 0x3f800000;
    auVar222._0_16_ = auVar218;
    auVar222._20_4_ = 0x3f800000;
    auVar222._24_4_ = 0x3f800000;
    auVar222._28_4_ = 0x3f800000;
    auVar43 = vsubps_avx(auVar218,auVar42);
    fVar195 = auVar42._0_4_;
    auVar113._0_4_ = local_1b8._0_4_ * fVar195;
    fVar89 = auVar42._4_4_;
    auVar113._4_4_ = local_1b8._4_4_ * fVar89;
    fVar190 = auVar42._8_4_;
    auVar113._8_4_ = local_1b8._8_4_ * fVar190;
    fVar191 = auVar42._12_4_;
    auVar113._12_4_ = local_1b8._12_4_ * fVar191;
    auVar123._0_4_ = local_1c8._0_4_ * fVar195;
    auVar123._4_4_ = local_1c8._4_4_ * fVar89;
    auVar123._8_4_ = local_1c8._8_4_ * fVar190;
    auVar123._12_4_ = local_1c8._12_4_ * fVar191;
    auVar132._0_4_ = local_1d8._0_4_ * fVar195;
    auVar132._4_4_ = local_1d8._4_4_ * fVar89;
    auVar132._8_4_ = local_1d8._8_4_ * fVar190;
    auVar132._12_4_ = local_1d8._12_4_ * fVar191;
    auVar97._0_4_ = local_1e8._0_4_ * fVar195;
    auVar97._4_4_ = local_1e8._4_4_ * fVar89;
    auVar97._8_4_ = local_1e8._8_4_ * fVar190;
    auVar97._12_4_ = local_1e8._12_4_ * fVar191;
    auVar44 = vfmadd231ps_fma(auVar113,auVar43,local_178);
    auVar38 = vfmadd231ps_fma(auVar123,auVar43,local_188);
    auVar34 = vfmadd231ps_avx512vl(auVar132,auVar43,local_198);
    auVar43 = vfmadd231ps_fma(auVar97,local_1a8,auVar43);
    auVar42 = vmovshdup_avx(auVar32);
    fVar89 = auVar32._0_4_;
    fVar195 = (auVar42._0_4_ - fVar89) * 0.04761905;
    auVar158._4_4_ = fVar89;
    auVar158._0_4_ = fVar89;
    auVar158._8_4_ = fVar89;
    auVar158._12_4_ = fVar89;
    auVar158._16_4_ = fVar89;
    auVar158._20_4_ = fVar89;
    auVar158._24_4_ = fVar89;
    auVar158._28_4_ = fVar89;
    auVar109._0_8_ = auVar42._0_8_;
    auVar109._8_8_ = auVar109._0_8_;
    auVar109._16_8_ = auVar109._0_8_;
    auVar109._24_8_ = auVar109._0_8_;
    auVar55 = vsubps_avx(auVar109,auVar158);
    uVar90 = auVar44._0_4_;
    auVar110._4_4_ = uVar90;
    auVar110._0_4_ = uVar90;
    auVar110._8_4_ = uVar90;
    auVar110._12_4_ = uVar90;
    auVar110._16_4_ = uVar90;
    auVar110._20_4_ = uVar90;
    auVar110._24_4_ = uVar90;
    auVar110._28_4_ = uVar90;
    auVar177._8_4_ = 1;
    auVar177._0_8_ = 0x100000001;
    auVar177._12_4_ = 1;
    auVar177._16_4_ = 1;
    auVar177._20_4_ = 1;
    auVar177._24_4_ = 1;
    auVar177._28_4_ = 1;
    auVar70 = ZEXT1632(auVar44);
    auVar53 = vpermps_avx2(auVar177,auVar70);
    auVar60 = vbroadcastss_avx512vl(auVar38);
    auVar71 = ZEXT1632(auVar38);
    auVar54 = vpermps_avx512vl(auVar177,auVar71);
    auVar61 = vbroadcastss_avx512vl(auVar34);
    auVar51 = ZEXT1632(auVar34);
    auVar62 = vpermps_avx512vl(auVar177,auVar51);
    auVar63 = vbroadcastss_avx512vl(auVar43);
    auVar67 = ZEXT1632(auVar43);
    auVar64 = vpermps_avx512vl(auVar177,auVar67);
    auVar178._4_4_ = fVar195;
    auVar178._0_4_ = fVar195;
    auVar178._8_4_ = fVar195;
    auVar178._12_4_ = fVar195;
    auVar178._16_4_ = fVar195;
    auVar178._20_4_ = fVar195;
    auVar178._24_4_ = fVar195;
    auVar178._28_4_ = fVar195;
    auVar68 = auVar237._0_32_;
    auVar52 = vpermps_avx512vl(auVar68,auVar70);
    auVar145._8_4_ = 3;
    auVar145._0_8_ = 0x300000003;
    auVar145._12_4_ = 3;
    auVar145._16_4_ = 3;
    auVar145._20_4_ = 3;
    auVar145._24_4_ = 3;
    auVar145._28_4_ = 3;
    auVar65 = vpermps_avx512vl(auVar145,auVar70);
    auVar66 = vpermps_avx512vl(auVar68,auVar71);
    auVar70 = vpermps_avx2(auVar145,auVar71);
    auVar50 = vpermps_avx512vl(auVar68,auVar51);
    auVar71 = vpermps_avx2(auVar145,auVar51);
    auVar51 = vpermps_avx512vl(auVar68,auVar67);
    auVar67 = vpermps_avx512vl(auVar145,auVar67);
    auVar42 = vfmadd132ps_fma(auVar55,auVar158,_DAT_02020f20);
    auVar55 = vsubps_avx(auVar222,ZEXT1632(auVar42));
    auVar68 = vmulps_avx512vl(auVar60,ZEXT1632(auVar42));
    auVar72 = ZEXT1632(auVar42);
    auVar69 = vmulps_avx512vl(auVar54,auVar72);
    auVar43 = vfmadd231ps_fma(auVar68,auVar55,auVar110);
    auVar44 = vfmadd231ps_fma(auVar69,auVar55,auVar53);
    auVar68 = vmulps_avx512vl(auVar61,auVar72);
    auVar69 = vmulps_avx512vl(auVar62,auVar72);
    auVar60 = vfmadd231ps_avx512vl(auVar68,auVar55,auVar60);
    auVar54 = vfmadd231ps_avx512vl(auVar69,auVar55,auVar54);
    auVar68 = vmulps_avx512vl(auVar63,auVar72);
    auVar69 = ZEXT1632(auVar42);
    auVar64 = vmulps_avx512vl(auVar64,auVar69);
    auVar61 = vfmadd231ps_avx512vl(auVar68,auVar55,auVar61);
    auVar62 = vfmadd231ps_avx512vl(auVar64,auVar55,auVar62);
    fVar190 = auVar42._0_4_;
    fVar191 = auVar42._4_4_;
    auVar16._4_4_ = fVar191 * auVar60._4_4_;
    auVar16._0_4_ = fVar190 * auVar60._0_4_;
    fVar192 = auVar42._8_4_;
    auVar16._8_4_ = fVar192 * auVar60._8_4_;
    fVar193 = auVar42._12_4_;
    auVar16._12_4_ = fVar193 * auVar60._12_4_;
    auVar16._16_4_ = auVar60._16_4_ * 0.0;
    auVar16._20_4_ = auVar60._20_4_ * 0.0;
    auVar16._24_4_ = auVar60._24_4_ * 0.0;
    auVar16._28_4_ = fVar89;
    auVar17._4_4_ = fVar191 * auVar54._4_4_;
    auVar17._0_4_ = fVar190 * auVar54._0_4_;
    auVar17._8_4_ = fVar192 * auVar54._8_4_;
    auVar17._12_4_ = fVar193 * auVar54._12_4_;
    auVar17._16_4_ = auVar54._16_4_ * 0.0;
    auVar17._20_4_ = auVar54._20_4_ * 0.0;
    auVar17._24_4_ = auVar54._24_4_ * 0.0;
    auVar17._28_4_ = auVar53._28_4_;
    auVar43 = vfmadd231ps_fma(auVar16,auVar55,ZEXT1632(auVar43));
    auVar44 = vfmadd231ps_fma(auVar17,auVar55,ZEXT1632(auVar44));
    auVar103._0_4_ = fVar190 * auVar61._0_4_;
    auVar103._4_4_ = fVar191 * auVar61._4_4_;
    auVar103._8_4_ = fVar192 * auVar61._8_4_;
    auVar103._12_4_ = fVar193 * auVar61._12_4_;
    auVar103._16_4_ = auVar61._16_4_ * 0.0;
    auVar103._20_4_ = auVar61._20_4_ * 0.0;
    auVar103._24_4_ = auVar61._24_4_ * 0.0;
    auVar103._28_4_ = 0;
    auVar18._4_4_ = fVar191 * auVar62._4_4_;
    auVar18._0_4_ = fVar190 * auVar62._0_4_;
    auVar18._8_4_ = fVar192 * auVar62._8_4_;
    auVar18._12_4_ = fVar193 * auVar62._12_4_;
    auVar18._16_4_ = auVar62._16_4_ * 0.0;
    auVar18._20_4_ = auVar62._20_4_ * 0.0;
    auVar18._24_4_ = auVar62._24_4_ * 0.0;
    auVar18._28_4_ = auVar61._28_4_;
    auVar38 = vfmadd231ps_fma(auVar103,auVar55,auVar60);
    auVar34 = vfmadd231ps_fma(auVar18,auVar55,auVar54);
    auVar19._28_4_ = auVar54._28_4_;
    auVar19._0_28_ =
         ZEXT1628(CONCAT412(fVar193 * auVar34._12_4_,
                            CONCAT48(fVar192 * auVar34._8_4_,
                                     CONCAT44(fVar191 * auVar34._4_4_,fVar190 * auVar34._0_4_))));
    auVar33 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar193 * auVar38._12_4_,
                                                 CONCAT48(fVar192 * auVar38._8_4_,
                                                          CONCAT44(fVar191 * auVar38._4_4_,
                                                                   fVar190 * auVar38._0_4_)))),
                              auVar55,ZEXT1632(auVar43));
    auVar35 = vfmadd231ps_fma(auVar19,auVar55,ZEXT1632(auVar44));
    auVar53 = vsubps_avx(ZEXT1632(auVar38),ZEXT1632(auVar43));
    auVar60 = vsubps_avx(ZEXT1632(auVar34),ZEXT1632(auVar44));
    auVar54 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
    auVar53 = vmulps_avx512vl(auVar53,auVar54);
    auVar60 = vmulps_avx512vl(auVar60,auVar54);
    auVar169._0_4_ = fVar195 * auVar53._0_4_;
    auVar169._4_4_ = fVar195 * auVar53._4_4_;
    auVar169._8_4_ = fVar195 * auVar53._8_4_;
    auVar169._12_4_ = fVar195 * auVar53._12_4_;
    auVar169._16_4_ = fVar195 * auVar53._16_4_;
    auVar169._20_4_ = fVar195 * auVar53._20_4_;
    auVar169._24_4_ = fVar195 * auVar53._24_4_;
    auVar169._28_4_ = 0;
    auVar53 = vmulps_avx512vl(auVar178,auVar60);
    auVar38 = vxorps_avx512vl(auVar63._0_16_,auVar63._0_16_);
    auVar60 = vpermt2ps_avx512vl(ZEXT1632(auVar33),_DAT_0205fd20,ZEXT1632(auVar38));
    auVar61 = vpermt2ps_avx512vl(ZEXT1632(auVar35),_DAT_0205fd20,ZEXT1632(auVar38));
    auVar104._0_4_ = auVar169._0_4_ + auVar33._0_4_;
    auVar104._4_4_ = auVar169._4_4_ + auVar33._4_4_;
    auVar104._8_4_ = auVar169._8_4_ + auVar33._8_4_;
    auVar104._12_4_ = auVar169._12_4_ + auVar33._12_4_;
    auVar104._16_4_ = auVar169._16_4_ + 0.0;
    auVar104._20_4_ = auVar169._20_4_ + 0.0;
    auVar104._24_4_ = auVar169._24_4_ + 0.0;
    auVar104._28_4_ = 0;
    auVar72 = ZEXT1632(auVar38);
    auVar62 = vpermt2ps_avx512vl(auVar169,_DAT_0205fd20,auVar72);
    auVar63 = vaddps_avx512vl(ZEXT1632(auVar35),auVar53);
    auVar64 = vpermt2ps_avx512vl(auVar53,_DAT_0205fd20,auVar72);
    auVar53 = vsubps_avx(auVar60,auVar62);
    auVar62 = vsubps_avx512vl(auVar61,auVar64);
    auVar64 = vmulps_avx512vl(auVar66,auVar69);
    auVar68 = vmulps_avx512vl(auVar70,auVar69);
    auVar64 = vfmadd231ps_avx512vl(auVar64,auVar55,auVar52);
    auVar52 = vfmadd231ps_avx512vl(auVar68,auVar55,auVar65);
    auVar65 = vmulps_avx512vl(auVar50,auVar69);
    auVar68 = vmulps_avx512vl(auVar71,auVar69);
    auVar65 = vfmadd231ps_avx512vl(auVar65,auVar55,auVar66);
    auVar70 = vfmadd231ps_avx512vl(auVar68,auVar55,auVar70);
    auVar66 = vmulps_avx512vl(auVar51,auVar69);
    auVar51 = vmulps_avx512vl(auVar67,auVar69);
    auVar43 = vfmadd231ps_fma(auVar66,auVar55,auVar50);
    auVar44 = vfmadd231ps_fma(auVar51,auVar55,auVar71);
    auVar66 = vmulps_avx512vl(auVar69,auVar65);
    auVar51 = vmulps_avx512vl(ZEXT1632(auVar42),auVar70);
    auVar64 = vfmadd231ps_avx512vl(auVar66,auVar55,auVar64);
    auVar52 = vfmadd231ps_avx512vl(auVar51,auVar55,auVar52);
    auVar65 = vfmadd231ps_avx512vl
                        (ZEXT1632(CONCAT412(fVar193 * auVar43._12_4_,
                                            CONCAT48(fVar192 * auVar43._8_4_,
                                                     CONCAT44(fVar191 * auVar43._4_4_,
                                                              fVar190 * auVar43._0_4_)))),auVar55,
                         auVar65);
    auVar70 = vfmadd231ps_avx512vl
                        (ZEXT1632(CONCAT412(fVar193 * auVar44._12_4_,
                                            CONCAT48(fVar192 * auVar44._8_4_,
                                                     CONCAT44(fVar191 * auVar44._4_4_,
                                                              fVar190 * auVar44._0_4_)))),auVar55,
                         auVar70);
    auVar20._4_4_ = fVar191 * auVar65._4_4_;
    auVar20._0_4_ = fVar190 * auVar65._0_4_;
    auVar20._8_4_ = fVar192 * auVar65._8_4_;
    auVar20._12_4_ = fVar193 * auVar65._12_4_;
    auVar20._16_4_ = auVar65._16_4_ * 0.0;
    auVar20._20_4_ = auVar65._20_4_ * 0.0;
    auVar20._24_4_ = auVar65._24_4_ * 0.0;
    auVar20._28_4_ = auVar71._28_4_;
    auVar21._4_4_ = fVar191 * auVar70._4_4_;
    auVar21._0_4_ = fVar190 * auVar70._0_4_;
    auVar21._8_4_ = fVar192 * auVar70._8_4_;
    auVar21._12_4_ = fVar193 * auVar70._12_4_;
    auVar21._16_4_ = auVar70._16_4_ * 0.0;
    auVar21._20_4_ = auVar70._20_4_ * 0.0;
    auVar21._24_4_ = auVar70._24_4_ * 0.0;
    auVar21._28_4_ = auVar50._28_4_;
    auVar71 = vfmadd231ps_avx512vl(auVar20,auVar55,auVar64);
    auVar66 = vfmadd231ps_avx512vl(auVar21,auVar52,auVar55);
    auVar55 = vsubps_avx512vl(auVar65,auVar64);
    auVar70 = vsubps_avx512vl(auVar70,auVar52);
    auVar55 = vmulps_avx512vl(auVar55,auVar54);
    auVar70 = vmulps_avx512vl(auVar70,auVar54);
    fVar89 = fVar195 * auVar55._0_4_;
    fVar190 = fVar195 * auVar55._4_4_;
    auVar22._4_4_ = fVar190;
    auVar22._0_4_ = fVar89;
    fVar191 = fVar195 * auVar55._8_4_;
    auVar22._8_4_ = fVar191;
    fVar192 = fVar195 * auVar55._12_4_;
    auVar22._12_4_ = fVar192;
    fVar193 = fVar195 * auVar55._16_4_;
    auVar22._16_4_ = fVar193;
    fVar194 = fVar195 * auVar55._20_4_;
    auVar22._20_4_ = fVar194;
    fVar195 = fVar195 * auVar55._24_4_;
    auVar22._24_4_ = fVar195;
    auVar22._28_4_ = auVar55._28_4_;
    auVar70 = vmulps_avx512vl(auVar178,auVar70);
    auVar54 = vpermt2ps_avx512vl(auVar71,_DAT_0205fd20,auVar72);
    auVar64 = vpermt2ps_avx512vl(auVar66,_DAT_0205fd20,auVar72);
    auVar179._0_4_ = auVar71._0_4_ + fVar89;
    auVar179._4_4_ = auVar71._4_4_ + fVar190;
    auVar179._8_4_ = auVar71._8_4_ + fVar191;
    auVar179._12_4_ = auVar71._12_4_ + fVar192;
    auVar179._16_4_ = auVar71._16_4_ + fVar193;
    auVar179._20_4_ = auVar71._20_4_ + fVar194;
    auVar179._24_4_ = auVar71._24_4_ + fVar195;
    auVar179._28_4_ = auVar71._28_4_ + auVar55._28_4_;
    auVar55 = vpermt2ps_avx512vl(auVar22,_DAT_0205fd20,ZEXT1632(auVar38));
    auVar52 = vaddps_avx512vl(auVar66,auVar70);
    auVar70 = vpermt2ps_avx512vl(auVar70,_DAT_0205fd20,ZEXT1632(auVar38));
    auVar55 = vsubps_avx(auVar54,auVar55);
    auVar70 = vsubps_avx512vl(auVar64,auVar70);
    auVar119 = ZEXT1632(auVar33);
    auVar65 = vsubps_avx512vl(auVar71,auVar119);
    auVar127 = ZEXT1632(auVar35);
    auVar50 = vsubps_avx512vl(auVar66,auVar127);
    auVar51 = vsubps_avx512vl(auVar54,auVar60);
    auVar65 = vaddps_avx512vl(auVar65,auVar51);
    auVar51 = vsubps_avx512vl(auVar64,auVar61);
    auVar50 = vaddps_avx512vl(auVar50,auVar51);
    auVar51 = vmulps_avx512vl(auVar127,auVar65);
    auVar51 = vfnmadd231ps_avx512vl(auVar51,auVar119,auVar50);
    auVar67 = vmulps_avx512vl(auVar63,auVar65);
    auVar67 = vfnmadd231ps_avx512vl(auVar67,auVar104,auVar50);
    auVar68 = vmulps_avx512vl(auVar62,auVar65);
    auVar68 = vfnmadd231ps_avx512vl(auVar68,auVar53,auVar50);
    auVar69 = vmulps_avx512vl(auVar61,auVar65);
    auVar69 = vfnmadd231ps_avx512vl(auVar69,auVar60,auVar50);
    auVar72 = vmulps_avx512vl(auVar66,auVar65);
    auVar72 = vfnmadd231ps_avx512vl(auVar72,auVar71,auVar50);
    auVar73 = vmulps_avx512vl(auVar52,auVar65);
    auVar73 = vfnmadd231ps_avx512vl(auVar73,auVar179,auVar50);
    auVar74 = vmulps_avx512vl(auVar70,auVar65);
    auVar74 = vfnmadd231ps_avx512vl(auVar74,auVar55,auVar50);
    auVar65 = vmulps_avx512vl(auVar64,auVar65);
    auVar65 = vfnmadd231ps_avx512vl(auVar65,auVar54,auVar50);
    auVar50 = vminps_avx512vl(auVar51,auVar67);
    auVar51 = vmaxps_avx512vl(auVar51,auVar67);
    auVar67 = vminps_avx512vl(auVar68,auVar69);
    auVar50 = vminps_avx512vl(auVar50,auVar67);
    auVar67 = vmaxps_avx512vl(auVar68,auVar69);
    auVar51 = vmaxps_avx512vl(auVar51,auVar67);
    auVar67 = vminps_avx512vl(auVar72,auVar73);
    auVar68 = vmaxps_avx512vl(auVar72,auVar73);
    auVar69 = vminps_avx512vl(auVar74,auVar65);
    auVar67 = vminps_avx512vl(auVar67,auVar69);
    auVar50 = vminps_avx512vl(auVar50,auVar67);
    auVar65 = vmaxps_avx512vl(auVar74,auVar65);
    auVar65 = vmaxps_avx512vl(auVar68,auVar65);
    auVar65 = vmaxps_avx512vl(auVar51,auVar65);
    uVar12 = vcmpps_avx512vl(auVar50,local_78,2);
    uVar13 = vcmpps_avx512vl(auVar65,local_98,5);
    uVar27 = 0;
    bVar23 = (byte)uVar12 & (byte)uVar13 & 0x7f;
    if (bVar23 != 0) {
      auVar65 = vsubps_avx512vl(auVar60,auVar119);
      auVar50 = vsubps_avx512vl(auVar61,auVar127);
      auVar51 = vsubps_avx512vl(auVar54,auVar71);
      auVar65 = vaddps_avx512vl(auVar65,auVar51);
      auVar51 = vsubps_avx512vl(auVar64,auVar66);
      auVar50 = vaddps_avx512vl(auVar50,auVar51);
      auVar51 = vmulps_avx512vl(auVar127,auVar65);
      auVar51 = vfnmadd231ps_avx512vl(auVar51,auVar50,auVar119);
      auVar63 = vmulps_avx512vl(auVar63,auVar65);
      auVar63 = vfnmadd213ps_avx512vl(auVar104,auVar50,auVar63);
      auVar62 = vmulps_avx512vl(auVar62,auVar65);
      auVar62 = vfnmadd213ps_avx512vl(auVar53,auVar50,auVar62);
      auVar53 = vmulps_avx512vl(auVar61,auVar65);
      auVar61 = vfnmadd231ps_avx512vl(auVar53,auVar50,auVar60);
      auVar53 = vmulps_avx512vl(auVar66,auVar65);
      auVar66 = vfnmadd231ps_avx512vl(auVar53,auVar50,auVar71);
      auVar53 = vmulps_avx512vl(auVar52,auVar65);
      auVar52 = vfnmadd213ps_avx512vl(auVar179,auVar50,auVar53);
      auVar53 = vmulps_avx512vl(auVar70,auVar65);
      auVar67 = vfnmadd213ps_avx512vl(auVar55,auVar50,auVar53);
      auVar55 = vmulps_avx512vl(auVar64,auVar65);
      auVar64 = vfnmadd231ps_avx512vl(auVar55,auVar54,auVar50);
      auVar53 = vminps_avx(auVar51,auVar63);
      auVar55 = vmaxps_avx(auVar51,auVar63);
      auVar60 = vminps_avx(auVar62,auVar61);
      auVar60 = vminps_avx(auVar53,auVar60);
      auVar53 = vmaxps_avx(auVar62,auVar61);
      auVar55 = vmaxps_avx(auVar55,auVar53);
      auVar71 = vminps_avx(auVar66,auVar52);
      auVar53 = vmaxps_avx(auVar66,auVar52);
      auVar54 = vminps_avx(auVar67,auVar64);
      auVar71 = vminps_avx(auVar71,auVar54);
      auVar71 = vminps_avx(auVar60,auVar71);
      auVar60 = vmaxps_avx(auVar67,auVar64);
      auVar53 = vmaxps_avx(auVar53,auVar60);
      auVar55 = vmaxps_avx(auVar55,auVar53);
      uVar12 = vcmpps_avx512vl(auVar55,local_98,5);
      uVar13 = vcmpps_avx512vl(auVar71,local_78,2);
      uVar27 = (uint)(bVar23 & (byte)uVar12 & (byte)uVar13);
    }
    if (uVar27 != 0) {
      auStack_168[uVar29] = uVar27;
      uVar12 = vmovlps_avx(auVar32);
      *(undefined8 *)(&uStack_d8 + uVar29 * 2) = uVar12;
      uVar25 = vmovlps_avx512f(auVar36);
      auStack_58[uVar29] = uVar25;
      uVar29 = (ulong)((int)uVar29 + 1);
    }
    auVar32 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
    auVar232 = ZEXT1664(auVar32);
    auVar32 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
    auVar233 = ZEXT1664(auVar32);
    auVar55 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
    in_ZMM19 = ZEXT3264(auVar55);
    auVar234 = ZEXT464(0x3f800000);
    auVar87._16_16_ = auVar55._16_16_;
    auVar32 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
    auVar235 = ZEXT1664(auVar32);
    auVar32 = vxorps_avx512vl(auVar70._0_16_,auVar70._0_16_);
    auVar231 = ZEXT1664(auVar32);
    auVar238 = ZEXT1664(local_308);
    auVar87._0_16_ = local_318;
    auVar240 = ZEXT1664(local_318);
    do {
      auVar32 = auVar235._0_16_;
      if ((int)uVar29 == 0) {
        fVar195 = (ray->super_RayK<1>).tfar;
        auVar15._4_4_ = fVar195;
        auVar15._0_4_ = fVar195;
        auVar15._8_4_ = fVar195;
        auVar15._12_4_ = fVar195;
        auVar15._16_4_ = fVar195;
        auVar15._20_4_ = fVar195;
        auVar15._24_4_ = fVar195;
        auVar15._28_4_ = fVar195;
        uVar12 = vcmpps_avx512vl(local_b8,auVar15,2);
        uVar31 = (uint)local_360 & (uint)local_330 & (uint)uVar12;
        local_360 = (ulong)uVar31;
        if (uVar31 == 0) {
          return;
        }
        goto LAB_01d94176;
      }
      uVar24 = (int)uVar29 - 1;
      uVar26 = (ulong)uVar24;
      uVar27 = (&uStack_d8)[uVar26 * 2];
      fVar195 = afStack_d4[uVar26 * 2];
      uVar5 = auStack_168[uVar26];
      auVar223._8_8_ = 0;
      auVar223._0_8_ = auStack_58[uVar26];
      auVar229 = ZEXT1664(auVar223);
      lVar30 = 0;
      for (uVar25 = (ulong)uVar5; (uVar25 & 1) == 0; uVar25 = uVar25 >> 1 | 0x8000000000000000) {
        lVar30 = lVar30 + 1;
      }
      uVar28 = uVar5 - 1 & uVar5;
      auStack_168[uVar26] = uVar28;
      if (uVar28 == 0) {
        uVar29 = (ulong)uVar24;
      }
      auVar43 = vpxord_avx512vl(auVar236._0_16_,auVar236._0_16_);
      auVar42 = vcvtsi2ss_avx512f(auVar43,lVar30);
      auVar44 = vmulss_avx512f(auVar42,SUB6416(ZEXT464(0x3e124925),0));
      lVar30 = lVar30 + 1;
      auVar42 = vpxord_avx512vl(auVar43,auVar43);
      auVar42 = vcvtsi2ss_avx512f(auVar42,lVar30);
      auVar42 = vmulss_avx512f(auVar42,SUB6416(ZEXT464(0x3e124925),0));
      auVar38 = auVar234._0_16_;
      auVar43 = vsubss_avx512f(auVar38,auVar44);
      local_348 = vfmadd231ss_fma(ZEXT416((uint)(fVar195 * auVar44._0_4_)),ZEXT416(uVar27),auVar43);
      auVar43 = vsubss_avx512f(auVar38,auVar42);
      auVar42 = vfmadd231ss_fma(ZEXT416((uint)(fVar195 * auVar42._0_4_)),ZEXT416(uVar27),auVar43);
      fVar89 = auVar42._0_4_;
      fVar190 = local_348._0_4_;
      fVar195 = fVar89 - fVar190;
      vucomiss_avx512f(ZEXT416((uint)fVar195));
      if (uVar5 == 0 || lVar30 == 0) break;
      auVar236 = ZEXT1664(auVar223);
      auVar43 = vshufps_avx(auVar223,auVar223,0x50);
      vucomiss_avx512f(ZEXT416((uint)fVar195));
      auVar33 = vsubps_avx512vl(auVar32,auVar43);
      fVar191 = auVar43._0_4_;
      auVar114._0_4_ = fVar191 * (float)local_1b8._0_4_;
      fVar192 = auVar43._4_4_;
      auVar114._4_4_ = fVar192 * (float)local_1b8._4_4_;
      fVar193 = auVar43._8_4_;
      auVar114._8_4_ = fVar193 * fStack_1b0;
      fVar194 = auVar43._12_4_;
      auVar114._12_4_ = fVar194 * fStack_1ac;
      auVar124._0_4_ = fVar191 * (float)local_1c8._0_4_;
      auVar124._4_4_ = fVar192 * (float)local_1c8._4_4_;
      auVar124._8_4_ = fVar193 * fStack_1c0;
      auVar124._12_4_ = fVar194 * fStack_1bc;
      auVar133._0_4_ = fVar191 * (float)local_1d8._0_4_;
      auVar133._4_4_ = fVar192 * (float)local_1d8._4_4_;
      auVar133._8_4_ = fVar193 * fStack_1d0;
      auVar133._12_4_ = fVar194 * fStack_1cc;
      auVar98._0_4_ = fVar191 * (float)local_1e8._0_4_;
      auVar98._4_4_ = fVar192 * (float)local_1e8._4_4_;
      auVar98._8_4_ = fVar193 * fStack_1e0;
      auVar98._12_4_ = fVar194 * fStack_1dc;
      auVar43 = vfmadd231ps_fma(auVar114,auVar33,local_178);
      auVar44 = vfmadd231ps_fma(auVar124,auVar33,local_188);
      auVar34 = vfmadd231ps_fma(auVar133,auVar33,local_198);
      auVar33 = vfmadd231ps_fma(auVar98,auVar33,local_1a8);
      auVar111._16_16_ = auVar43;
      auVar111._0_16_ = auVar43;
      auVar120._16_16_ = auVar44;
      auVar120._0_16_ = auVar44;
      auVar128._16_16_ = auVar34;
      auVar128._0_16_ = auVar34;
      auVar146._4_4_ = fVar190;
      auVar146._0_4_ = fVar190;
      auVar146._8_4_ = fVar190;
      auVar146._12_4_ = fVar190;
      auVar146._20_4_ = fVar89;
      auVar146._16_4_ = fVar89;
      auVar146._24_4_ = fVar89;
      auVar146._28_4_ = fVar89;
      auVar55 = vsubps_avx(auVar120,auVar111);
      auVar44 = vfmadd213ps_fma(auVar55,auVar146,auVar111);
      auVar55 = vsubps_avx(auVar128,auVar120);
      auVar35 = vfmadd213ps_fma(auVar55,auVar146,auVar120);
      auVar43 = vsubps_avx(auVar33,auVar34);
      auVar121._16_16_ = auVar43;
      auVar121._0_16_ = auVar43;
      auVar43 = vfmadd213ps_fma(auVar121,auVar146,auVar128);
      auVar55 = vsubps_avx(ZEXT1632(auVar35),ZEXT1632(auVar44));
      auVar44 = vfmadd213ps_fma(auVar55,auVar146,ZEXT1632(auVar44));
      auVar55 = vsubps_avx(ZEXT1632(auVar43),ZEXT1632(auVar35));
      auVar43 = vfmadd213ps_fma(auVar55,auVar146,ZEXT1632(auVar35));
      auVar55 = vsubps_avx(ZEXT1632(auVar43),ZEXT1632(auVar44));
      auVar45 = vfmadd231ps_fma(ZEXT1632(auVar44),auVar55,auVar146);
      auVar55 = vmulps_avx512vl(auVar55,in_ZMM19._0_32_);
      auVar76._16_16_ = auVar55._16_16_;
      auVar43 = vmulss_avx512f(ZEXT416((uint)fVar195),SUB6416(ZEXT464(0x3eaaaaab),0));
      fVar89 = auVar43._0_4_;
      auVar134._0_8_ =
           CONCAT44(auVar45._4_4_ + fVar89 * auVar55._4_4_,auVar45._0_4_ + fVar89 * auVar55._0_4_);
      auVar134._8_4_ = auVar45._8_4_ + fVar89 * auVar55._8_4_;
      auVar134._12_4_ = auVar45._12_4_ + fVar89 * auVar55._12_4_;
      auVar115._0_4_ = fVar89 * auVar55._16_4_;
      auVar115._4_4_ = fVar89 * auVar55._20_4_;
      auVar115._8_4_ = fVar89 * auVar55._24_4_;
      auVar115._12_4_ = fVar89 * auVar55._28_4_;
      auVar49 = vsubps_avx((undefined1  [16])0x0,auVar115);
      auVar37 = vshufpd_avx(auVar45,auVar45,3);
      auVar39 = vshufpd_avx((undefined1  [16])0x0,(undefined1  [16])0x0,3);
      auVar43 = vsubps_avx(auVar37,auVar45);
      auVar44 = vsubps_avx(auVar39,(undefined1  [16])0x0);
      auVar148._0_4_ = auVar44._0_4_ + auVar43._0_4_;
      auVar148._4_4_ = auVar44._4_4_ + auVar43._4_4_;
      auVar148._8_4_ = auVar44._8_4_ + auVar43._8_4_;
      auVar148._12_4_ = auVar44._12_4_ + auVar43._12_4_;
      auVar43 = vshufps_avx(auVar45,auVar45,0xb1);
      auVar44 = vshufps_avx(auVar134,auVar134,0xb1);
      auVar34 = vshufps_avx(auVar49,auVar49,0xb1);
      auVar33 = vshufps_avx((undefined1  [16])0x0,(undefined1  [16])0x0,0xb1);
      auVar210._4_4_ = auVar148._0_4_;
      auVar210._0_4_ = auVar148._0_4_;
      auVar210._8_4_ = auVar148._0_4_;
      auVar210._12_4_ = auVar148._0_4_;
      auVar35 = vshufps_avx(auVar148,auVar148,0x55);
      fVar89 = auVar35._0_4_;
      auVar163._0_4_ = auVar43._0_4_ * fVar89;
      fVar190 = auVar35._4_4_;
      auVar163._4_4_ = auVar43._4_4_ * fVar190;
      fVar191 = auVar35._8_4_;
      auVar163._8_4_ = auVar43._8_4_ * fVar191;
      fVar192 = auVar35._12_4_;
      auVar163._12_4_ = auVar43._12_4_ * fVar192;
      auVar174._0_4_ = auVar44._0_4_ * fVar89;
      auVar174._4_4_ = auVar44._4_4_ * fVar190;
      auVar174._8_4_ = auVar44._8_4_ * fVar191;
      auVar174._12_4_ = auVar44._12_4_ * fVar192;
      auVar182._0_4_ = auVar34._0_4_ * fVar89;
      auVar182._4_4_ = auVar34._4_4_ * fVar190;
      auVar182._8_4_ = auVar34._8_4_ * fVar191;
      auVar182._12_4_ = auVar34._12_4_ * fVar192;
      auVar149._0_4_ = auVar33._0_4_ * fVar89;
      auVar149._4_4_ = auVar33._4_4_ * fVar190;
      auVar149._8_4_ = auVar33._8_4_ * fVar191;
      auVar149._12_4_ = auVar33._12_4_ * fVar192;
      auVar43 = vfmadd231ps_fma(auVar163,auVar210,auVar45);
      auVar44 = vfmadd231ps_fma(auVar174,auVar210,auVar134);
      auVar35 = vfmadd231ps_fma(auVar182,auVar210,auVar49);
      auVar96 = vfmadd231ps_fma(auVar149,(undefined1  [16])0x0,auVar210);
      auVar36 = vshufpd_avx(auVar43,auVar43,1);
      auVar40 = vshufpd_avx(auVar44,auVar44,1);
      auVar41 = vshufpd_avx(auVar35,auVar35,1);
      auVar47 = vshufpd_avx(auVar96,auVar96,1);
      auVar34 = vminss_avx(auVar43,auVar44);
      auVar43 = vmaxss_avx(auVar44,auVar43);
      auVar33 = vminss_avx(auVar35,auVar96);
      auVar44 = vmaxss_avx(auVar96,auVar35);
      auVar33 = vminss_avx(auVar34,auVar33);
      auVar43 = vmaxss_avx(auVar44,auVar43);
      auVar35 = vminss_avx(auVar36,auVar40);
      auVar44 = vmaxss_avx(auVar40,auVar36);
      auVar36 = vminss_avx(auVar41,auVar47);
      auVar34 = vmaxss_avx(auVar47,auVar41);
      auVar35 = vminss_avx(auVar35,auVar36);
      auVar44 = vmaxss_avx(auVar34,auVar44);
      fVar191 = auVar33._0_4_;
      fVar190 = auVar44._0_4_;
      fVar89 = auVar43._0_4_;
      if ((0.0001 <= fVar191) || (fVar190 <= -0.0001)) {
        uVar12 = vcmpps_avx512vl(auVar35,SUB6416(ZEXT464(0x38d1b717),0),1);
        uVar13 = vcmpps_avx512vl(auVar33,SUB6416(ZEXT464(0x38d1b717),0),1);
        if ((-0.0001 < fVar89 & ((byte)uVar13 | (byte)uVar12)) != 0) goto LAB_01d94fb1;
        uVar12 = vcmpps_avx512vl(SUB6416(ZEXT464(0xb8d1b717),0),auVar44,5);
        uVar13 = vcmpps_avx512vl(auVar35,SUB6416(ZEXT464(0x38d1b717),0),5);
        if ((((ushort)uVar13 | (ushort)uVar12) & 1) == 0) goto LAB_01d94fb1;
LAB_01d959b3:
        bVar10 = true;
        auVar87._16_16_ = auVar76._16_16_;
        auVar87._0_16_ = auVar223;
        auVar229 = ZEXT1664(auVar223);
      }
      else {
LAB_01d94fb1:
        uVar12 = vcmpss_avx512f(auVar33,auVar231._0_16_,1);
        bVar10 = (bool)((byte)uVar12 & 1);
        iVar88 = auVar234._0_4_;
        fVar192 = (float)((uint)bVar10 * -0x40800000 + (uint)!bVar10 * iVar88);
        uVar12 = vcmpss_avx512f(auVar43,ZEXT816(0) << 0x20,1);
        bVar10 = (bool)((byte)uVar12 & 1);
        fVar193 = (float)((uint)bVar10 * -0x40800000 + (uint)!bVar10 * iVar88);
        auVar76._0_16_ = SUB6416(ZEXT464(0x7f800000),0);
        auVar75._4_28_ = auVar76._4_28_;
        auVar75._0_4_ = (uint)(fVar192 == fVar193) * 0x7f800000;
        auVar36 = auVar75._0_16_;
        auVar78._16_16_ = auVar76._16_16_;
        auVar78._0_16_ = SUB6416(ZEXT464(0xff800000),0);
        auVar77._4_28_ = auVar78._4_28_;
        auVar77._0_4_ = (uint)(fVar192 == fVar193) * -0x800000;
        auVar34 = auVar77._0_16_;
        uVar12 = vcmpss_avx512f(auVar35,ZEXT816(0) << 0x20,1);
        bVar10 = (bool)((byte)uVar12 & 1);
        fVar194 = (float)((uint)bVar10 * -0x40800000 + (uint)!bVar10 * iVar88);
        auVar40 = ZEXT416(0xbf800000);
        if ((fVar192 != fVar194) || (NAN(fVar192) || NAN(fVar194))) {
          fVar192 = auVar35._0_4_;
          bVar10 = fVar192 == fVar191;
          if ((!bVar10) || (NAN(fVar192) || NAN(fVar191))) {
            auVar33 = vxorps_avx512vl(auVar33,auVar233._0_16_);
            auVar224._0_4_ = auVar33._0_4_ / (fVar192 - fVar191);
            auVar224._4_12_ = auVar33._4_12_;
            auVar33 = vsubss_avx512f(auVar38,auVar224);
            auVar40 = vxorps_avx512vl(auVar40,auVar40);
            auVar35 = vfmadd213ss_avx512f(auVar33,auVar40,auVar224);
            auVar33 = auVar35;
          }
          else {
            auVar40 = vxorps_avx512vl(auVar40,auVar40);
            vucomiss_avx512f(auVar40);
            auVar80._16_16_ = auVar76._16_16_;
            auVar80._0_16_ = SUB6416(ZEXT464(0x7f800000),0);
            auVar79._4_28_ = auVar80._4_28_;
            auVar79._0_4_ = (uint)bVar10 * auVar40._0_4_ + (uint)!bVar10 * 0x7f800000;
            auVar35 = auVar79._0_16_;
            auVar33 = ZEXT416((uint)bVar10 * 0x3f800000 + (uint)!bVar10 * -0x800000);
          }
          auVar36 = vminss_avx(auVar36,auVar35);
          auVar34 = vmaxss_avx(auVar33,auVar34);
        }
        else {
          auVar40 = vxorps_avx512vl(auVar40,auVar40);
        }
        auVar231 = ZEXT1664(auVar40);
        uVar12 = vcmpss_avx512f(auVar44,auVar40,1);
        bVar10 = (bool)((byte)uVar12 & 1);
        fVar191 = (float)((uint)bVar10 * -0x40800000 + (uint)!bVar10 * iVar88);
        if ((fVar193 != fVar191) || (NAN(fVar193) || NAN(fVar191))) {
          bVar10 = fVar190 == fVar89;
          if ((!bVar10) || (NAN(fVar190) || NAN(fVar89))) {
            auVar43 = vxorps_avx512vl(auVar43,auVar233._0_16_);
            auVar183._0_4_ = auVar43._0_4_ / (fVar190 - fVar89);
            auVar183._4_12_ = auVar43._4_12_;
            auVar43 = vsubss_avx512f(auVar38,auVar183);
            auVar44 = vfmadd213ss_avx512f(auVar43,auVar40,auVar183);
            auVar43 = auVar44;
          }
          else {
            vucomiss_avx512f(auVar40);
            auVar82._16_16_ = auVar76._16_16_;
            auVar82._0_16_ = SUB6416(ZEXT464(0x7f800000),0);
            auVar81._4_28_ = auVar82._4_28_;
            auVar81._0_4_ = (uint)bVar10 * auVar40._0_4_ + (uint)!bVar10 * 0x7f800000;
            auVar44 = auVar81._0_16_;
            auVar43 = ZEXT416((uint)bVar10 * 0x3f800000 + (uint)!bVar10 * -0x800000);
          }
          auVar36 = vminss_avx(auVar36,auVar44);
          auVar34 = vmaxss_avx(auVar43,auVar34);
        }
        bVar10 = fVar194 != fVar191;
        auVar43 = vminss_avx512f(auVar36,auVar38);
        auVar84._16_16_ = auVar76._16_16_;
        auVar84._0_16_ = auVar36;
        auVar83._4_28_ = auVar84._4_28_;
        auVar83._0_4_ = (uint)bVar10 * auVar43._0_4_ + (uint)!bVar10 * auVar36._0_4_;
        auVar43 = vmaxss_avx512f(auVar38,auVar34);
        auVar86._16_16_ = auVar76._16_16_;
        auVar86._0_16_ = auVar34;
        auVar85._4_28_ = auVar86._4_28_;
        auVar85._0_4_ = (uint)bVar10 * auVar43._0_4_ + (uint)!bVar10 * auVar34._0_4_;
        auVar43 = vmaxss_avx512f(auVar40,auVar83._0_16_);
        auVar44 = vminss_avx512f(auVar85._0_16_,auVar38);
        bVar10 = true;
        if (auVar44._0_4_ < auVar43._0_4_) goto LAB_01d959b3;
        auVar33 = vmaxss_avx512f(auVar40,ZEXT416((uint)(auVar43._0_4_ + -0.1)));
        auVar40 = vminss_avx512f(ZEXT416((uint)(auVar44._0_4_ + 0.1)),auVar38);
        auVar99._0_8_ = auVar45._0_8_;
        auVar99._8_8_ = auVar99._0_8_;
        auVar175._8_8_ = auVar134._0_8_;
        auVar175._0_8_ = auVar134._0_8_;
        auVar184._8_8_ = auVar49._0_8_;
        auVar184._0_8_ = auVar49._0_8_;
        auVar43 = vshufpd_avx(auVar134,auVar134,3);
        auVar44 = vshufpd_avx(auVar49,auVar49,3);
        auVar34 = vshufps_avx(auVar33,auVar40,0);
        auVar41 = vsubps_avx512vl(auVar32,auVar34);
        fVar89 = auVar34._0_4_;
        auVar219._0_4_ = fVar89 * auVar37._0_4_;
        fVar190 = auVar34._4_4_;
        auVar219._4_4_ = fVar190 * auVar37._4_4_;
        fVar191 = auVar34._8_4_;
        auVar219._8_4_ = fVar191 * auVar37._8_4_;
        fVar192 = auVar34._12_4_;
        auVar219._12_4_ = fVar192 * auVar37._12_4_;
        auVar135._0_4_ = fVar89 * auVar43._0_4_;
        auVar135._4_4_ = fVar190 * auVar43._4_4_;
        auVar135._8_4_ = fVar191 * auVar43._8_4_;
        auVar135._12_4_ = fVar192 * auVar43._12_4_;
        auVar142._0_4_ = fVar89 * auVar44._0_4_;
        auVar142._4_4_ = fVar190 * auVar44._4_4_;
        auVar142._8_4_ = fVar191 * auVar44._8_4_;
        auVar142._12_4_ = fVar192 * auVar44._12_4_;
        auVar116._0_4_ = fVar89 * auVar39._0_4_;
        auVar116._4_4_ = fVar190 * auVar39._4_4_;
        auVar116._8_4_ = fVar191 * auVar39._8_4_;
        auVar116._12_4_ = fVar192 * auVar39._12_4_;
        auVar35 = vfmadd231ps_fma(auVar219,auVar41,auVar99);
        auVar36 = vfmadd231ps_fma(auVar135,auVar41,auVar175);
        auVar37 = vfmadd231ps_fma(auVar142,auVar41,auVar184);
        auVar39 = vfmadd231ps_fma(auVar116,auVar41,ZEXT816(0));
        auVar43 = vsubss_avx512f(auVar38,auVar33);
        auVar44 = vmovshdup_avx512vl(auVar223);
        auVar45 = vfmadd231ss_avx512f(ZEXT416((uint)(auVar44._0_4_ * auVar33._0_4_)),auVar223,
                                      auVar43);
        auVar43 = vsubss_avx512f(auVar38,auVar40);
        auVar46 = vfmadd231ss_avx512f(ZEXT416((uint)(auVar40._0_4_ * auVar44._0_4_)),auVar223,
                                      auVar43);
        auVar40 = vdivss_avx512f(auVar38,ZEXT416((uint)fVar195));
        auVar43 = vsubps_avx(auVar36,auVar35);
        auVar122 = auVar241._0_16_;
        auVar34 = vmulps_avx512vl(auVar43,auVar122);
        auVar43 = vsubps_avx(auVar37,auVar36);
        auVar33 = vmulps_avx512vl(auVar43,auVar122);
        auVar43 = vsubps_avx(auVar39,auVar37);
        auVar43 = vmulps_avx512vl(auVar43,auVar122);
        auVar44 = vminps_avx(auVar33,auVar43);
        auVar43 = vmaxps_avx(auVar33,auVar43);
        auVar44 = vminps_avx(auVar34,auVar44);
        auVar43 = vmaxps_avx(auVar34,auVar43);
        auVar34 = vshufpd_avx(auVar44,auVar44,3);
        auVar33 = vshufpd_avx(auVar43,auVar43,3);
        auVar44 = vminps_avx(auVar44,auVar34);
        auVar43 = vmaxps_avx(auVar43,auVar33);
        fVar195 = auVar40._0_4_;
        auVar164._0_4_ = fVar195 * auVar44._0_4_;
        auVar164._4_4_ = fVar195 * auVar44._4_4_;
        auVar164._8_4_ = fVar195 * auVar44._8_4_;
        auVar164._12_4_ = fVar195 * auVar44._12_4_;
        auVar150._0_4_ = fVar195 * auVar43._0_4_;
        auVar150._4_4_ = fVar195 * auVar43._4_4_;
        auVar150._8_4_ = fVar195 * auVar43._8_4_;
        auVar150._12_4_ = fVar195 * auVar43._12_4_;
        auVar40 = vdivss_avx512f(auVar38,ZEXT416((uint)(auVar46._0_4_ - auVar45._0_4_)));
        auVar43 = vshufpd_avx(auVar35,auVar35,3);
        auVar44 = vshufpd_avx(auVar36,auVar36,3);
        auVar34 = vshufpd_avx(auVar37,auVar37,3);
        auVar33 = vshufpd_avx(auVar39,auVar39,3);
        auVar43 = vsubps_avx(auVar43,auVar35);
        auVar35 = vsubps_avx(auVar44,auVar36);
        auVar36 = vsubps_avx(auVar34,auVar37);
        auVar33 = vsubps_avx(auVar33,auVar39);
        auVar44 = vminps_avx(auVar43,auVar35);
        auVar43 = vmaxps_avx(auVar43,auVar35);
        auVar34 = vminps_avx(auVar36,auVar33);
        auVar34 = vminps_avx(auVar44,auVar34);
        auVar44 = vmaxps_avx(auVar36,auVar33);
        auVar43 = vmaxps_avx(auVar43,auVar44);
        fVar195 = auVar40._0_4_;
        auVar185._0_4_ = fVar195 * auVar34._0_4_;
        auVar185._4_4_ = fVar195 * auVar34._4_4_;
        auVar185._8_4_ = fVar195 * auVar34._8_4_;
        auVar185._12_4_ = fVar195 * auVar34._12_4_;
        auVar199._0_4_ = fVar195 * auVar43._0_4_;
        auVar199._4_4_ = fVar195 * auVar43._4_4_;
        auVar199._8_4_ = fVar195 * auVar43._8_4_;
        auVar199._12_4_ = fVar195 * auVar43._12_4_;
        auVar236 = ZEXT1664(local_348);
        auVar96 = vinsertps_avx512f(local_348,auVar45,0x10);
        auVar35 = vinsertps_avx(auVar42,auVar46,0x10);
        auVar91._0_4_ = auVar96._0_4_ + auVar35._0_4_;
        auVar91._4_4_ = auVar96._4_4_ + auVar35._4_4_;
        auVar91._8_4_ = auVar96._8_4_ + auVar35._8_4_;
        auVar91._12_4_ = auVar96._12_4_ + auVar35._12_4_;
        auVar14._8_4_ = 0x3f000000;
        auVar14._0_8_ = 0x3f0000003f000000;
        auVar14._12_4_ = 0x3f000000;
        auVar47 = vmulps_avx512vl(auVar91,auVar14);
        auVar34 = vshufps_avx(auVar47,auVar47,0x54);
        uVar90 = auVar47._0_4_;
        auVar105._4_4_ = uVar90;
        auVar105._0_4_ = uVar90;
        auVar105._8_4_ = uVar90;
        auVar105._12_4_ = uVar90;
        auVar36 = vfmadd213ps_avx512vl(auVar238._0_16_,auVar105,auVar239._0_16_);
        auVar44 = vfmadd213ps_fma(auVar240._0_16_,auVar105,local_2e8);
        auVar33 = vfmadd213ps_fma(local_e8,auVar105,local_2f8);
        auVar43 = vsubps_avx(auVar44,auVar36);
        auVar36 = vfmadd213ps_fma(auVar43,auVar105,auVar36);
        auVar43 = vsubps_avx(auVar33,auVar44);
        auVar43 = vfmadd213ps_fma(auVar43,auVar105,auVar44);
        auVar43 = vsubps_avx(auVar43,auVar36);
        auVar44 = vfmadd231ps_fma(auVar36,auVar43,auVar105);
        auVar37 = vmulps_avx512vl(auVar43,auVar122);
        auVar211._8_8_ = auVar44._0_8_;
        auVar211._0_8_ = auVar44._0_8_;
        auVar43 = vshufpd_avx(auVar44,auVar44,3);
        auVar44 = vshufps_avx(auVar47,auVar47,0x55);
        auVar33 = vsubps_avx(auVar43,auVar211);
        auVar36 = vfmadd231ps_fma(auVar211,auVar44,auVar33);
        auVar225._8_8_ = auVar37._0_8_;
        auVar225._0_8_ = auVar37._0_8_;
        auVar43 = vshufpd_avx(auVar37,auVar37,3);
        auVar43 = vsubps_avx(auVar43,auVar225);
        auVar44 = vfmadd213ps_fma(auVar43,auVar44,auVar225);
        auVar106._0_8_ = auVar33._0_8_ ^ 0x8000000080000000;
        auVar106._8_4_ = auVar33._8_4_ ^ 0x80000000;
        auVar106._12_4_ = auVar33._12_4_ ^ 0x80000000;
        auVar43 = vmovshdup_avx(auVar44);
        auVar226._0_8_ = auVar43._0_8_ ^ 0x8000000080000000;
        auVar226._8_4_ = auVar43._8_4_ ^ 0x80000000;
        auVar226._12_4_ = auVar43._12_4_ ^ 0x80000000;
        auVar37 = vmovshdup_avx512vl(auVar33);
        auVar39 = vpermt2ps_avx512vl(auVar226,ZEXT416(5),auVar33);
        auVar43 = vfmsub231ss_avx512f(ZEXT416((uint)(auVar43._0_4_ * auVar33._0_4_)),auVar44,auVar37
                                     );
        auVar44 = vpermt2ps_avx512vl(auVar44,SUB6416(ZEXT464(4),0),auVar106);
        auVar117._0_4_ = auVar43._0_4_;
        auVar117._4_4_ = auVar117._0_4_;
        auVar117._8_4_ = auVar117._0_4_;
        auVar117._12_4_ = auVar117._0_4_;
        auVar43 = vdivps_avx(auVar39,auVar117);
        auVar44 = vdivps_avx(auVar44,auVar117);
        fVar89 = auVar36._0_4_;
        auVar33 = vshufps_avx(auVar36,auVar36,0x55);
        fVar195 = auVar44._0_4_;
        auVar212._0_4_ = fVar89 * auVar43._0_4_ + auVar33._0_4_ * fVar195;
        auVar212._4_4_ = fVar89 * auVar43._4_4_ + auVar33._4_4_ * auVar44._4_4_;
        auVar212._8_4_ = fVar89 * auVar43._8_4_ + auVar33._8_4_ * auVar44._8_4_;
        auVar212._12_4_ = fVar89 * auVar43._12_4_ + auVar33._12_4_ * auVar44._12_4_;
        auVar49 = vsubps_avx(auVar34,auVar212);
        auVar36 = vmovshdup_avx(auVar43);
        auVar34 = vinsertps_avx(auVar164,auVar185,0x1c);
        auVar227._0_4_ = auVar36._0_4_ * auVar34._0_4_;
        auVar227._4_4_ = auVar36._4_4_ * auVar34._4_4_;
        auVar227._8_4_ = auVar36._8_4_ * auVar34._8_4_;
        auVar227._12_4_ = auVar36._12_4_ * auVar34._12_4_;
        auVar33 = vinsertps_avx(auVar150,auVar199,0x1c);
        auVar213._0_4_ = auVar36._0_4_ * auVar33._0_4_;
        auVar213._4_4_ = auVar36._4_4_ * auVar33._4_4_;
        auVar213._8_4_ = auVar36._8_4_ * auVar33._8_4_;
        auVar213._12_4_ = auVar36._12_4_ * auVar33._12_4_;
        auVar41 = vminps_avx512vl(auVar227,auVar213);
        auVar39 = vmaxps_avx(auVar213,auVar227);
        auVar40 = vmovshdup_avx(auVar44);
        auVar36 = vinsertps_avx(auVar185,auVar164,0x4c);
        auVar186._0_4_ = auVar40._0_4_ * auVar36._0_4_;
        auVar186._4_4_ = auVar40._4_4_ * auVar36._4_4_;
        auVar186._8_4_ = auVar40._8_4_ * auVar36._8_4_;
        auVar186._12_4_ = auVar40._12_4_ * auVar36._12_4_;
        auVar37 = vinsertps_avx(auVar199,auVar150,0x4c);
        auVar200._0_4_ = auVar40._0_4_ * auVar37._0_4_;
        auVar200._4_4_ = auVar40._4_4_ * auVar37._4_4_;
        auVar200._8_4_ = auVar40._8_4_ * auVar37._8_4_;
        auVar200._12_4_ = auVar40._12_4_ * auVar37._12_4_;
        auVar40 = vminps_avx(auVar186,auVar200);
        auVar41 = vaddps_avx512vl(auVar41,auVar40);
        auVar40 = vmaxps_avx(auVar200,auVar186);
        auVar187._0_4_ = auVar39._0_4_ + auVar40._0_4_;
        auVar187._4_4_ = auVar39._4_4_ + auVar40._4_4_;
        auVar187._8_4_ = auVar39._8_4_ + auVar40._8_4_;
        auVar187._12_4_ = auVar39._12_4_ + auVar40._12_4_;
        auVar201._8_8_ = 0x3f80000000000000;
        auVar201._0_8_ = 0x3f80000000000000;
        auVar39 = vsubps_avx(auVar201,auVar187);
        auVar40 = vsubps_avx(auVar201,auVar41);
        auVar41 = vsubps_avx(auVar96,auVar47);
        auVar47 = vsubps_avx(auVar35,auVar47);
        fVar193 = auVar41._0_4_;
        auVar228._0_4_ = fVar193 * auVar39._0_4_;
        fVar194 = auVar41._4_4_;
        auVar228._4_4_ = fVar194 * auVar39._4_4_;
        fVar95 = auVar41._8_4_;
        auVar228._8_4_ = fVar95 * auVar39._8_4_;
        fVar112 = auVar41._12_4_;
        auVar228._12_4_ = fVar112 * auVar39._12_4_;
        auVar48 = vbroadcastss_avx512vl(auVar43);
        auVar34 = vmulps_avx512vl(auVar48,auVar34);
        auVar33 = vmulps_avx512vl(auVar48,auVar33);
        auVar48 = vminps_avx512vl(auVar34,auVar33);
        auVar34 = vmaxps_avx(auVar33,auVar34);
        auVar165._0_4_ = fVar195 * auVar36._0_4_;
        auVar165._4_4_ = fVar195 * auVar36._4_4_;
        auVar165._8_4_ = fVar195 * auVar36._8_4_;
        auVar165._12_4_ = fVar195 * auVar36._12_4_;
        auVar151._0_4_ = fVar195 * auVar37._0_4_;
        auVar151._4_4_ = fVar195 * auVar37._4_4_;
        auVar151._8_4_ = fVar195 * auVar37._8_4_;
        auVar151._12_4_ = fVar195 * auVar37._12_4_;
        auVar33 = vminps_avx(auVar165,auVar151);
        auVar36 = vaddps_avx512vl(auVar48,auVar33);
        auVar37 = vmulps_avx512vl(auVar41,auVar40);
        fVar89 = auVar47._0_4_;
        auVar188._0_4_ = fVar89 * auVar39._0_4_;
        fVar190 = auVar47._4_4_;
        auVar188._4_4_ = fVar190 * auVar39._4_4_;
        fVar191 = auVar47._8_4_;
        auVar188._8_4_ = fVar191 * auVar39._8_4_;
        fVar192 = auVar47._12_4_;
        auVar188._12_4_ = fVar192 * auVar39._12_4_;
        auVar202._0_4_ = fVar89 * auVar40._0_4_;
        auVar202._4_4_ = fVar190 * auVar40._4_4_;
        auVar202._8_4_ = fVar191 * auVar40._8_4_;
        auVar202._12_4_ = fVar192 * auVar40._12_4_;
        auVar33 = vmaxps_avx(auVar151,auVar165);
        auVar152._0_4_ = auVar34._0_4_ + auVar33._0_4_;
        auVar152._4_4_ = auVar34._4_4_ + auVar33._4_4_;
        auVar152._8_4_ = auVar34._8_4_ + auVar33._8_4_;
        auVar152._12_4_ = auVar34._12_4_ + auVar33._12_4_;
        auVar166._8_8_ = 0x3f800000;
        auVar166._0_8_ = 0x3f800000;
        auVar34 = vsubps_avx(auVar166,auVar152);
        auVar33 = vsubps_avx(auVar166,auVar36);
        auVar220._0_4_ = fVar193 * auVar34._0_4_;
        auVar220._4_4_ = fVar194 * auVar34._4_4_;
        auVar220._8_4_ = fVar95 * auVar34._8_4_;
        auVar220._12_4_ = fVar112 * auVar34._12_4_;
        auVar214._0_4_ = fVar193 * auVar33._0_4_;
        auVar214._4_4_ = fVar194 * auVar33._4_4_;
        auVar214._8_4_ = fVar95 * auVar33._8_4_;
        auVar214._12_4_ = fVar112 * auVar33._12_4_;
        auVar153._0_4_ = fVar89 * auVar34._0_4_;
        auVar153._4_4_ = fVar190 * auVar34._4_4_;
        auVar153._8_4_ = fVar191 * auVar34._8_4_;
        auVar153._12_4_ = fVar192 * auVar34._12_4_;
        auVar167._0_4_ = fVar89 * auVar33._0_4_;
        auVar167._4_4_ = fVar190 * auVar33._4_4_;
        auVar167._8_4_ = fVar191 * auVar33._8_4_;
        auVar167._12_4_ = fVar192 * auVar33._12_4_;
        auVar34 = vminps_avx(auVar220,auVar214);
        auVar33 = vminps_avx(auVar153,auVar167);
        auVar36 = vminps_avx(auVar34,auVar33);
        auVar34 = vmaxps_avx(auVar214,auVar220);
        auVar33 = vmaxps_avx(auVar167,auVar153);
        auVar33 = vmaxps_avx(auVar33,auVar34);
        auVar39 = vminps_avx512vl(auVar228,auVar37);
        auVar34 = vminps_avx(auVar188,auVar202);
        auVar34 = vminps_avx(auVar39,auVar34);
        auVar34 = vhaddps_avx(auVar36,auVar34);
        auVar39 = vmaxps_avx512vl(auVar37,auVar228);
        auVar36 = vmaxps_avx(auVar202,auVar188);
        auVar36 = vmaxps_avx(auVar36,auVar39);
        auVar33 = vhaddps_avx(auVar33,auVar36);
        auVar34 = vshufps_avx(auVar34,auVar34,0xe8);
        auVar33 = vshufps_avx(auVar33,auVar33,0xe8);
        auVar154._0_4_ = auVar34._0_4_ + auVar49._0_4_;
        auVar154._4_4_ = auVar34._4_4_ + auVar49._4_4_;
        auVar154._8_4_ = auVar34._8_4_ + auVar49._8_4_;
        auVar154._12_4_ = auVar34._12_4_ + auVar49._12_4_;
        auVar168._0_4_ = auVar33._0_4_ + auVar49._0_4_;
        auVar168._4_4_ = auVar33._4_4_ + auVar49._4_4_;
        auVar168._8_4_ = auVar33._8_4_ + auVar49._8_4_;
        auVar168._12_4_ = auVar33._12_4_ + auVar49._12_4_;
        auVar34 = vmaxps_avx(auVar96,auVar154);
        auVar33 = vminps_avx(auVar168,auVar35);
        uVar25 = vcmpps_avx512vl(auVar33,auVar34,1);
        local_298 = vinsertps_avx(auVar45,auVar46,0x10);
        auVar229 = ZEXT1664(local_298);
        if ((uVar25 & 3) == 0) {
          vucomiss_avx512f(local_348);
          auVar34 = vxorps_avx512vl(auVar37,auVar37);
          auVar231 = ZEXT1664(auVar34);
          auVar87._16_16_ = auVar76._16_16_;
          auVar87._0_16_ = local_358;
          auVar239 = ZEXT1664(local_358);
          if ((uint)uVar29 < 4 && (uVar5 == 0 || lVar30 == 0)) {
            bVar10 = false;
          }
          else {
            lVar30 = 200;
            do {
              auVar33 = vsubss_avx512f(auVar38,auVar49);
              fVar191 = auVar33._0_4_;
              fVar89 = fVar191 * fVar191 * fVar191;
              fVar192 = auVar49._0_4_;
              fVar190 = fVar192 * 3.0 * fVar191 * fVar191;
              fVar191 = fVar191 * fVar192 * fVar192 * 3.0;
              auVar136._4_4_ = fVar89;
              auVar136._0_4_ = fVar89;
              auVar136._8_4_ = fVar89;
              auVar136._12_4_ = fVar89;
              auVar125._4_4_ = fVar190;
              auVar125._0_4_ = fVar190;
              auVar125._8_4_ = fVar190;
              auVar125._12_4_ = fVar190;
              auVar100._4_4_ = fVar191;
              auVar100._0_4_ = fVar191;
              auVar100._8_4_ = fVar191;
              auVar100._12_4_ = fVar191;
              fVar192 = fVar192 * fVar192 * fVar192;
              auVar143._0_4_ = (float)local_1f8._0_4_ * fVar192;
              auVar143._4_4_ = (float)local_1f8._4_4_ * fVar192;
              auVar143._8_4_ = fStack_1f0 * fVar192;
              auVar143._12_4_ = fStack_1ec * fVar192;
              auVar33 = vfmadd231ps_fma(auVar143,local_2f8,auVar100);
              auVar33 = vfmadd231ps_fma(auVar33,local_2e8,auVar125);
              auVar33 = vfmadd231ps_avx512vl(auVar33,local_358,auVar136);
              auVar101._8_8_ = auVar33._0_8_;
              auVar101._0_8_ = auVar33._0_8_;
              auVar33 = vshufpd_avx(auVar33,auVar33,3);
              auVar35 = vshufps_avx(auVar49,auVar49,0x55);
              auVar33 = vsubps_avx(auVar33,auVar101);
              auVar35 = vfmadd213ps_fma(auVar33,auVar35,auVar101);
              fVar89 = auVar35._0_4_;
              auVar33 = vshufps_avx(auVar35,auVar35,0x55);
              auVar102._0_4_ = auVar43._0_4_ * fVar89 + fVar195 * auVar33._0_4_;
              auVar102._4_4_ = auVar43._4_4_ * fVar89 + auVar44._4_4_ * auVar33._4_4_;
              auVar102._8_4_ = auVar43._8_4_ * fVar89 + auVar44._8_4_ * auVar33._8_4_;
              auVar102._12_4_ = auVar43._12_4_ * fVar89 + auVar44._12_4_ * auVar33._12_4_;
              auVar49 = vsubps_avx(auVar49,auVar102);
              auVar33 = vandps_avx512vl(auVar35,auVar232._0_16_);
              auVar87._0_16_ = vprolq_avx512vl(auVar33,0x20);
              auVar33 = vmaxss_avx(auVar87._0_16_,auVar33);
              bVar11 = auVar33._0_4_ <= (float)local_208._0_4_;
              if (auVar33._0_4_ < (float)local_208._0_4_) {
                auVar43 = vucomiss_avx512f(auVar34);
                if (bVar11) {
                  auVar44 = vucomiss_avx512f(auVar43);
                  auVar234 = ZEXT1664(auVar44);
                  if (bVar11) {
                    vmovshdup_avx(auVar43);
                    auVar44 = vucomiss_avx512f(auVar34);
                    if (bVar11) {
                      auVar38 = vucomiss_avx512f(auVar44);
                      auVar234 = ZEXT1664(auVar38);
                      if (bVar11) {
                        auVar33 = vinsertps_avx(ZEXT416((uint)(pre->ray_space).vx.field_0.m128[2]),
                                                ZEXT416((uint)(pre->ray_space).vy.field_0.m128[2]),
                                                0x1c);
                        auVar47 = vinsertps_avx(auVar33,ZEXT416((uint)(pre->ray_space).vz.field_0.
                                                                      m128[2]),0x28);
                        aVar1 = (ray->super_RayK<1>).org.field_0;
                        auVar33 = vsubps_avx(local_218,(undefined1  [16])aVar1);
                        auVar33 = vdpps_avx(auVar33,auVar47,0x7f);
                        auVar35 = vsubps_avx(local_258,(undefined1  [16])aVar1);
                        auVar35 = vdpps_avx(auVar35,auVar47,0x7f);
                        auVar36 = vsubps_avx(local_268,(undefined1  [16])aVar1);
                        auVar36 = vdpps_avx(auVar36,auVar47,0x7f);
                        auVar37 = vsubps_avx(local_238,(undefined1  [16])aVar1);
                        auVar37 = vdpps_avx(auVar37,auVar47,0x7f);
                        auVar39 = vsubps_avx(_local_228,(undefined1  [16])aVar1);
                        auVar39 = vdpps_avx(auVar39,auVar47,0x7f);
                        auVar40 = vsubps_avx(_local_278,(undefined1  [16])aVar1);
                        auVar40 = vdpps_avx(auVar40,auVar47,0x7f);
                        auVar41 = vsubps_avx(_local_288,(undefined1  [16])aVar1);
                        auVar41 = vdpps_avx(auVar41,auVar47,0x7f);
                        auVar49 = vsubps_avx(_local_248,(undefined1  [16])aVar1);
                        auVar47 = vdpps_avx(auVar49,auVar47,0x7f);
                        auVar49 = vsubss_avx512f(auVar38,auVar44);
                        fVar195 = auVar44._0_4_;
                        auVar44 = vfmadd231ss_fma(ZEXT416((uint)(auVar39._0_4_ * fVar195)),auVar49,
                                                  auVar33);
                        auVar33 = vfmadd231ss_fma(ZEXT416((uint)(auVar40._0_4_ * fVar195)),auVar49,
                                                  auVar35);
                        auVar35 = vfmadd231ss_fma(ZEXT416((uint)(auVar41._0_4_ * fVar195)),auVar49,
                                                  auVar36);
                        auVar36 = vfmadd231ss_fma(ZEXT416((uint)(fVar195 * auVar47._0_4_)),auVar49,
                                                  auVar37);
                        auVar87._0_16_ = vsubss_avx512f(auVar38,auVar43);
                        auVar144._0_4_ = auVar87._0_4_;
                        fVar195 = auVar144._0_4_ * auVar144._0_4_ * auVar144._0_4_;
                        fVar191 = auVar43._0_4_;
                        fVar89 = fVar191 * 3.0 * auVar144._0_4_ * auVar144._0_4_;
                        fVar190 = auVar144._0_4_ * fVar191 * fVar191 * 3.0;
                        fVar193 = fVar191 * fVar191 * fVar191;
                        auVar38 = vfmadd231ss_fma(ZEXT416((uint)(fVar193 * auVar36._0_4_)),
                                                  ZEXT416((uint)fVar190),auVar35);
                        auVar38 = vfmadd231ss_fma(auVar38,ZEXT416((uint)fVar89),auVar33);
                        auVar44 = vfmadd231ss_fma(auVar38,ZEXT416((uint)fVar195),auVar44);
                        fVar192 = auVar44._0_4_;
                        if (((ray->super_RayK<1>).org.field_0.m128[3] <= fVar192) &&
                           (local_364 = (ray->super_RayK<1>).tfar, fVar192 <= local_364)) {
                          auVar44 = vshufps_avx(auVar43,auVar43,0x55);
                          auVar33 = vsubps_avx512vl(auVar32,auVar44);
                          fVar194 = auVar44._0_4_;
                          auVar176._0_4_ = fVar194 * (float)local_228._0_4_;
                          fVar95 = auVar44._4_4_;
                          auVar176._4_4_ = fVar95 * (float)local_228._4_4_;
                          fVar112 = auVar44._8_4_;
                          auVar176._8_4_ = fVar112 * fStack_220;
                          fVar92 = auVar44._12_4_;
                          auVar176._12_4_ = fVar92 * fStack_21c;
                          auVar189._0_4_ = fVar194 * (float)local_278._0_4_;
                          auVar189._4_4_ = fVar95 * (float)local_278._4_4_;
                          auVar189._8_4_ = fVar112 * fStack_270;
                          auVar189._12_4_ = fVar92 * fStack_26c;
                          auVar203._0_4_ = fVar194 * (float)local_288._0_4_;
                          auVar203._4_4_ = fVar95 * (float)local_288._4_4_;
                          auVar203._8_4_ = fVar112 * fStack_280;
                          auVar203._12_4_ = fVar92 * fStack_27c;
                          auVar155._0_4_ = fVar194 * (float)local_248._0_4_;
                          auVar155._4_4_ = fVar95 * (float)local_248._4_4_;
                          auVar155._8_4_ = fVar112 * fStack_240;
                          auVar155._12_4_ = fVar92 * fStack_23c;
                          auVar32 = vfmadd231ps_fma(auVar176,auVar33,local_218);
                          auVar44 = vfmadd231ps_fma(auVar189,auVar33,local_258);
                          auVar38 = vfmadd231ps_fma(auVar203,auVar33,local_268);
                          auVar33 = vfmadd231ps_fma(auVar155,auVar33,local_238);
                          auVar32 = vsubps_avx(auVar44,auVar32);
                          auVar44 = vsubps_avx(auVar38,auVar44);
                          auVar38 = vsubps_avx(auVar33,auVar38);
                          auVar204._0_4_ = fVar191 * auVar44._0_4_;
                          auVar204._4_4_ = fVar191 * auVar44._4_4_;
                          auVar204._8_4_ = fVar191 * auVar44._8_4_;
                          auVar204._12_4_ = fVar191 * auVar44._12_4_;
                          auVar144._4_4_ = auVar144._0_4_;
                          auVar144._8_4_ = auVar144._0_4_;
                          auVar144._12_4_ = auVar144._0_4_;
                          auVar32 = vfmadd231ps_fma(auVar204,auVar144,auVar32);
                          auVar156._0_4_ = fVar191 * auVar38._0_4_;
                          auVar156._4_4_ = fVar191 * auVar38._4_4_;
                          auVar156._8_4_ = fVar191 * auVar38._8_4_;
                          auVar156._12_4_ = fVar191 * auVar38._12_4_;
                          auVar44 = vfmadd231ps_fma(auVar156,auVar144,auVar44);
                          auVar157._0_4_ = fVar191 * auVar44._0_4_;
                          auVar157._4_4_ = fVar191 * auVar44._4_4_;
                          auVar157._8_4_ = fVar191 * auVar44._8_4_;
                          auVar157._12_4_ = fVar191 * auVar44._12_4_;
                          auVar32 = vfmadd231ps_fma(auVar157,auVar144,auVar32);
                          auVar87._0_16_ = vmulps_avx512vl(auVar32,auVar122);
                          pGVar6 = (context->scene->geometries).items[uVar31].ptr;
                          if ((pGVar6->mask & (ray->super_RayK<1>).mask) != 0) {
                            auVar137._0_4_ = fVar193 * (float)local_128._0_4_;
                            auVar137._4_4_ = fVar193 * (float)local_128._4_4_;
                            auVar137._8_4_ = fVar193 * fStack_120;
                            auVar137._12_4_ = fVar193 * fStack_11c;
                            auVar126._4_4_ = fVar190;
                            auVar126._0_4_ = fVar190;
                            auVar126._8_4_ = fVar190;
                            auVar126._12_4_ = fVar190;
                            auVar32 = vfmadd132ps_fma(auVar126,auVar137,local_118);
                            auVar118._4_4_ = fVar89;
                            auVar118._0_4_ = fVar89;
                            auVar118._8_4_ = fVar89;
                            auVar118._12_4_ = fVar89;
                            auVar32 = vfmadd132ps_fma(auVar118,auVar32,local_108);
                            auVar107._4_4_ = fVar195;
                            auVar107._0_4_ = fVar195;
                            auVar107._8_4_ = fVar195;
                            auVar107._12_4_ = fVar195;
                            auVar38 = vfmadd132ps_fma(auVar107,auVar32,local_f8);
                            auVar32 = vshufps_avx(auVar38,auVar38,0xc9);
                            auVar44 = vshufps_avx(auVar87._0_16_,auVar87._0_16_,0xc9);
                            auVar108._0_4_ = auVar38._0_4_ * auVar44._0_4_;
                            auVar108._4_4_ = auVar38._4_4_ * auVar44._4_4_;
                            auVar108._8_4_ = auVar38._8_4_ * auVar44._8_4_;
                            auVar108._12_4_ = auVar38._12_4_ * auVar44._12_4_;
                            auVar32 = vfmsub231ps_fma(auVar108,auVar87._0_16_,auVar32);
                            if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                               (pGVar6->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                              (ray->super_RayK<1>).tfar = fVar192;
                              auVar44 = vshufps_avx(auVar32,auVar32,0xe9);
                              uVar12 = vmovlps_avx(auVar44);
                              *(undefined8 *)&(ray->Ng).field_0 = uVar12;
                              (ray->Ng).field_0.field_0.z = auVar32._0_4_;
                              uVar12 = vmovlps_avx(auVar43);
                              ray->u = (float)(int)uVar12;
                              ray->v = (float)(int)((ulong)uVar12 >> 0x20);
                              ray->primID = (uint)local_320;
                              ray->geomID = uVar31;
                              ray->instID[0] = context->user->instID[0];
                              ray->instPrimID[0] = context->user->instPrimID[0];
                            }
                            else {
                              auVar44 = vshufps_avx(auVar32,auVar32,0xe9);
                              local_158 = vmovlps_avx(auVar44);
                              local_150 = auVar32._0_4_;
                              local_14c = vmovlps_avx(auVar43);
                              local_144 = (uint)local_320;
                              local_140 = uVar31;
                              local_13c = context->user->instID[0];
                              local_138 = context->user->instPrimID[0];
                              (ray->super_RayK<1>).tfar = fVar192;
                              local_368 = -1;
                              local_2c8.valid = &local_368;
                              local_2c8.geometryUserPtr = pGVar6->userPtr;
                              local_2c8.context = context->user;
                              local_2c8.ray = (RTCRayN *)ray;
                              local_2c8.hit = (RTCHitN *)&local_158;
                              local_2c8.N = 1;
                              if (pGVar6->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_01d95b66:
                                auVar32 = auVar231._0_16_;
                                p_Var9 = context->args->filter;
                                if (p_Var9 != (RTCFilterFunctionN)0x0) {
                                  if (((context->args->flags &
                                       RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                                       RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                                     (((pGVar6->field_8).field_0x2 & 0x40) != 0)) {
                                    (*p_Var9)(&local_2c8);
                                    auVar229 = ZEXT1664(local_298);
                                    auVar240 = ZEXT1664(local_318);
                                    auVar238 = ZEXT1664(local_308);
                                    auVar239 = ZEXT1664(local_358);
                                    auVar32 = vxorps_avx512vl(auVar32,auVar32);
                                    auVar231 = ZEXT1664(auVar32);
                                    auVar32 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                                    auVar235 = ZEXT1664(auVar32);
                                    auVar234 = ZEXT464(0x3f800000);
                                    auVar55 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                                    in_ZMM19 = ZEXT3264(auVar55);
                                    auVar32 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                                    auVar233 = ZEXT1664(auVar32);
                                    auVar32 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                                    auVar232 = ZEXT1664(auVar32);
                                    auVar32 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                                    auVar241 = ZEXT1664(auVar32);
                                    auVar87 = vbroadcastss_avx512vl(ZEXT416(2));
                                    auVar237 = ZEXT3264(auVar87);
                                  }
                                  if (*local_2c8.valid == 0) goto LAB_01d95cb7;
                                }
                                (((Vec3f *)((long)local_2c8.ray + 0x30))->field_0).components[0] =
                                     *(float *)local_2c8.hit;
                                (((Vec3f *)((long)local_2c8.ray + 0x30))->field_0).field_0.y =
                                     *(float *)(local_2c8.hit + 4);
                                (((Vec3f *)((long)local_2c8.ray + 0x30))->field_0).field_0.z =
                                     *(float *)(local_2c8.hit + 8);
                                *(float *)((long)local_2c8.ray + 0x3c) =
                                     *(float *)(local_2c8.hit + 0xc);
                                *(float *)((long)local_2c8.ray + 0x40) =
                                     *(float *)(local_2c8.hit + 0x10);
                                *(float *)((long)local_2c8.ray + 0x44) =
                                     *(float *)(local_2c8.hit + 0x14);
                                *(float *)((long)local_2c8.ray + 0x48) =
                                     *(float *)(local_2c8.hit + 0x18);
                                *(float *)((long)local_2c8.ray + 0x4c) =
                                     *(float *)(local_2c8.hit + 0x1c);
                                *(float *)((long)local_2c8.ray + 0x50) =
                                     *(float *)(local_2c8.hit + 0x20);
                              }
                              else {
                                local_2d0 = context;
                                (*pGVar6->intersectionFilterN)(&local_2c8);
                                auVar229 = ZEXT1664(local_298);
                                auVar240 = ZEXT1664(local_318);
                                auVar238 = ZEXT1664(local_308);
                                auVar239 = ZEXT1664(local_358);
                                auVar32 = vxorps_avx512vl(auVar34,auVar34);
                                auVar231 = ZEXT1664(auVar32);
                                auVar32 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                                auVar235 = ZEXT1664(auVar32);
                                auVar234 = ZEXT464(0x3f800000);
                                auVar55 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                                in_ZMM19 = ZEXT3264(auVar55);
                                auVar32 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                                auVar233 = ZEXT1664(auVar32);
                                auVar32 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                                auVar232 = ZEXT1664(auVar32);
                                auVar32 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                                auVar241 = ZEXT1664(auVar32);
                                auVar87 = vbroadcastss_avx512vl(ZEXT416(2));
                                auVar237 = ZEXT3264(auVar87);
                                context = local_2d0;
                                if (*local_2c8.valid != 0) goto LAB_01d95b66;
LAB_01d95cb7:
                                (ray->super_RayK<1>).tfar = local_364;
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
                break;
              }
              lVar30 = lVar30 + -1;
            } while (lVar30 != 0);
          }
        }
        else {
          auVar32 = vxorps_avx512vl(auVar37,auVar37);
          auVar231 = ZEXT1664(auVar32);
          auVar239 = ZEXT1664(local_358);
          auVar87._16_16_ = auVar76._16_16_;
          auVar87._0_16_ = local_348;
        }
      }
    } while (bVar10);
    auVar32 = vinsertps_avx(local_348,auVar42,0x10);
  } while( true );
}

Assistant:

static __forceinline void intersect_hn(const Precalculations& pre, RayHit& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff p0,t0,p1,t1; Vec3fa n0,dn0,n1,dn1; geom->gather_hermite(p0,t0,n0,dn0,p1,t1,n1,dn1,geom->curve(primID));
          Intersector().intersect(pre,ray,context,geom,primID,p0,t0,p1,t1,n0,dn0,n1,dn1,Epilog(ray,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
      }